

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktApiFeatureInfo.cpp
# Opt level: O0

bool vkt::api::anon_unknown_0::validateFeatureLimits
               (VkPhysicalDeviceProperties *properties,VkPhysicalDeviceFeatures *features,
               TestLog *log)

{
  VkPhysicalDeviceLimits *value;
  MessageBuilder *pMVar1;
  float fVar2;
  uint local_311c;
  MessageBuilder local_3118;
  uint local_2f94;
  MessageBuilder local_2f90;
  MessageBuilder local_2e10;
  uint local_2c8c;
  undefined1 local_2c88 [4];
  deUint32 ndx_2;
  uint local_2b04;
  undefined1 local_2b00 [4];
  deUint32 limitToCheck_4;
  MessageBuilder local_2980;
  ulong local_2800;
  deUint64 limitToCheck_3;
  MessageBuilder local_2678;
  deUint32 local_24f4;
  undefined1 local_24f0 [4];
  deInt32 limitToCheck_2;
  MessageBuilder local_2370;
  float local_21ec;
  undefined1 local_21e8 [4];
  float limitToCheck_1;
  MessageBuilder local_2068;
  uint local_1ee4;
  uint local_1ee0;
  deUint32 limitToCheck;
  deUint32 ndx_1;
  deUint32 unsuppNdx;
  deUint32 ndx;
  MessageBuilder local_1ec8;
  float local_1d48 [2];
  UnsupportedFeatureLimitTable unsupportedFeatureTable [34];
  FeatureLimitTable featureLimitTable [121];
  VkPhysicalDeviceLimits *limits;
  bool limitsOk;
  TestLog *log_local;
  VkPhysicalDeviceFeatures *features_local;
  VkPhysicalDeviceProperties *properties_local;
  
  limits._7_1_ = true;
  value = &properties->limits;
  unsupportedFeatureTable[0x21].floatVal = 0.0;
  featureLimitTable[0]._0_8_ = anon_var_dwarf_1de3db;
  featureLimitTable[0].name._0_4_ = 0x1000;
  featureLimitTable[0].name._4_4_ = 0;
  featureLimitTable[0].uintVal = 0;
  featureLimitTable[0].intVal = 0;
  featureLimitTable[0].deviceSizeVal._0_4_ = 0;
  featureLimitTable[0].deviceSizeVal._4_4_ = 1;
  featureLimitTable[0].floatVal = 0.0;
  featureLimitTable[0].format = ~LIMIT_FORMAT_SIGNED_INT;
  featureLimitTable[0].type = 4;
  featureLimitTable[1]._0_8_ = anon_var_dwarf_1de3e5;
  featureLimitTable[1].name._0_4_ = 0x1000;
  featureLimitTable[1].name._4_4_ = 0;
  featureLimitTable[1].uintVal = 0;
  featureLimitTable[1].intVal = 0;
  featureLimitTable[1].deviceSizeVal._0_4_ = 0;
  featureLimitTable[1].deviceSizeVal._4_4_ = 1;
  featureLimitTable[1].floatVal = 0.0;
  featureLimitTable[1].format = ~LIMIT_FORMAT_SIGNED_INT;
  featureLimitTable[1].type = 8;
  featureLimitTable[2]._0_8_ = anon_var_dwarf_1de3ef;
  featureLimitTable[2].name._0_4_ = 0x100;
  featureLimitTable[2].name._4_4_ = 0;
  featureLimitTable[2].uintVal = 0;
  featureLimitTable[2].intVal = 0;
  featureLimitTable[2].deviceSizeVal._0_4_ = 0;
  featureLimitTable[2].deviceSizeVal._4_4_ = 1;
  featureLimitTable[2].floatVal = 0.0;
  featureLimitTable[2].format = ~LIMIT_FORMAT_SIGNED_INT;
  featureLimitTable[2].type = 0xc;
  featureLimitTable[3]._0_8_ = anon_var_dwarf_1de3f9;
  featureLimitTable[3].name._0_4_ = 0x1000;
  featureLimitTable[3].name._4_4_ = 0;
  featureLimitTable[3].uintVal = 0;
  featureLimitTable[3].intVal = 0;
  featureLimitTable[3].deviceSizeVal._0_4_ = 0;
  featureLimitTable[3].deviceSizeVal._4_4_ = 1;
  featureLimitTable[3].floatVal = 0.0;
  featureLimitTable[3].format = ~LIMIT_FORMAT_SIGNED_INT;
  featureLimitTable[3].type = 0x10;
  featureLimitTable[4]._0_8_ = anon_var_dwarf_1de403;
  featureLimitTable[4].name._0_4_ = 0x100;
  featureLimitTable[4].name._4_4_ = 0;
  featureLimitTable[4].uintVal = 0;
  featureLimitTable[4].intVal = 0;
  featureLimitTable[4].deviceSizeVal._0_4_ = 0;
  featureLimitTable[4].deviceSizeVal._4_4_ = 1;
  featureLimitTable[4].floatVal = 0.0;
  featureLimitTable[4].format = ~LIMIT_FORMAT_SIGNED_INT;
  featureLimitTable[4].type = 0x14;
  featureLimitTable[5]._0_8_ = anon_var_dwarf_1de40d;
  featureLimitTable[5].name._0_4_ = 0x10000;
  featureLimitTable[5].name._4_4_ = 0;
  featureLimitTable[5].uintVal = 0;
  featureLimitTable[5].intVal = 0;
  featureLimitTable[5].deviceSizeVal._0_4_ = 0;
  featureLimitTable[5].deviceSizeVal._4_4_ = 1;
  featureLimitTable[5].floatVal = 0.0;
  featureLimitTable[5].format = ~LIMIT_FORMAT_SIGNED_INT;
  featureLimitTable[5].type = 0x18;
  featureLimitTable[6]._0_8_ = anon_var_dwarf_1de417;
  featureLimitTable[6].name._0_4_ = 0x4000;
  featureLimitTable[6].name._4_4_ = 0;
  featureLimitTable[6].uintVal = 0;
  featureLimitTable[6].intVal = 0;
  featureLimitTable[6].deviceSizeVal._0_4_ = 0;
  featureLimitTable[6].deviceSizeVal._4_4_ = 1;
  featureLimitTable[6].floatVal = 0.0;
  featureLimitTable[6].format = ~LIMIT_FORMAT_SIGNED_INT;
  featureLimitTable[6].type = 0x1c;
  featureLimitTable[7]._0_8_ = anon_var_dwarf_1de421;
  featureLimitTable[7].name._0_4_ = 0;
  featureLimitTable[7].name._4_4_ = 0;
  featureLimitTable[7].uintVal = 0;
  featureLimitTable[7].intVal = 0;
  featureLimitTable[7].deviceSizeVal._0_4_ = 0;
  featureLimitTable[7].deviceSizeVal._4_4_ = 1;
  featureLimitTable[7].floatVal = 2.8026e-45;
  featureLimitTable[7].format = ~LIMIT_FORMAT_SIGNED_INT;
  featureLimitTable[7].type = 0x20;
  featureLimitTable[8]._0_8_ = anon_var_dwarf_1de42b;
  featureLimitTable[8].name._0_4_ = 0x80;
  featureLimitTable[8].name._4_4_ = 0;
  featureLimitTable[8].uintVal = 0;
  featureLimitTable[8].intVal = 0;
  featureLimitTable[8].deviceSizeVal._0_4_ = 0;
  featureLimitTable[8].deviceSizeVal._4_4_ = 1;
  featureLimitTable[8].floatVal = 0.0;
  featureLimitTable[8].format = ~LIMIT_FORMAT_SIGNED_INT;
  featureLimitTable[8].type = 0x24;
  featureLimitTable[9]._0_8_ = anon_var_dwarf_1de435;
  featureLimitTable[9].name._0_4_ = 0x1000;
  featureLimitTable[9].name._4_4_ = 0;
  featureLimitTable[9].uintVal = 0;
  featureLimitTable[9].intVal = 0;
  featureLimitTable[9].deviceSizeVal._0_4_ = 0;
  featureLimitTable[9].deviceSizeVal._4_4_ = 1;
  featureLimitTable[9].floatVal = 0.0;
  featureLimitTable[9].format = ~LIMIT_FORMAT_SIGNED_INT;
  featureLimitTable[9].type = 0x28;
  featureLimitTable[10]._0_8_ = anon_var_dwarf_1de43f;
  featureLimitTable[10].name._0_4_ = 0;
  featureLimitTable[10].name._4_4_ = 0;
  featureLimitTable[10].uintVal = 0;
  featureLimitTable[10].intVal = 0;
  featureLimitTable[10].deviceSizeVal._0_4_ = 0;
  featureLimitTable[10].deviceSizeVal._4_4_ = 1;
  featureLimitTable[10].floatVal = 2.8026e-45;
  featureLimitTable[10].format = ~LIMIT_FORMAT_SIGNED_INT;
  featureLimitTable[10].type = 0x30;
  featureLimitTable[0xb]._0_8_ = anon_var_dwarf_1de449;
  featureLimitTable[0xb].name._0_4_ = 0;
  featureLimitTable[0xb].name._4_4_ = 0;
  featureLimitTable[0xb].uintVal = 1;
  featureLimitTable[0xb].intVal = 0;
  featureLimitTable[0xb].deviceSizeVal._0_4_ = 0;
  featureLimitTable[0xb].deviceSizeVal._4_4_ = 3;
  featureLimitTable[0xb].floatVal = 0.0;
  featureLimitTable[0xb].format = ~LIMIT_FORMAT_SIGNED_INT;
  featureLimitTable[0xb].type = 0x30;
  featureLimitTable[0xc]._0_8_ = anon_var_dwarf_1de449;
  featureLimitTable[0xc].name._0_4_ = 0;
  featureLimitTable[0xc].name._4_4_ = 0;
  featureLimitTable[0xc].uintVal = 0x20000;
  featureLimitTable[0xc].intVal = 0;
  featureLimitTable[0xc].deviceSizeVal._0_4_ = 0;
  featureLimitTable[0xc].deviceSizeVal._4_4_ = 3;
  featureLimitTable[0xc].floatVal = 1.4013e-45;
  featureLimitTable[0xc].format = ~LIMIT_FORMAT_SIGNED_INT;
  featureLimitTable[0xc].type = 0x38;
  featureLimitTable[0xd]._0_8_ = anon_var_dwarf_1de453;
  featureLimitTable[0xd].name._0_4_ = 0;
  featureLimitTable[0xd].name._4_4_ = 0;
  featureLimitTable[0xd].uintVal = 0x80000000;
  featureLimitTable[0xd].intVal = 0;
  featureLimitTable[0xd].deviceSizeVal._0_4_ = 0;
  featureLimitTable[0xd].deviceSizeVal._4_4_ = 3;
  featureLimitTable[0xd].floatVal = 0.0;
  featureLimitTable[0xd].format = ~LIMIT_FORMAT_SIGNED_INT;
  featureLimitTable[0xd].type = 0x40;
  featureLimitTable[0xe]._0_8_ = anon_var_dwarf_1de45d;
  featureLimitTable[0xe].name._0_4_ = 4;
  featureLimitTable[0xe].name._4_4_ = 0;
  featureLimitTable[0xe].uintVal = 0;
  featureLimitTable[0xe].intVal = 0;
  featureLimitTable[0xe].deviceSizeVal._0_4_ = 0;
  featureLimitTable[0xe].deviceSizeVal._4_4_ = 1;
  featureLimitTable[0xe].floatVal = 0.0;
  featureLimitTable[0xe].format = ~LIMIT_FORMAT_SIGNED_INT;
  featureLimitTable[0xe].type = 0x44;
  featureLimitTable[0xf]._0_8_ = anon_var_dwarf_1de467;
  featureLimitTable[0xf].name._0_4_ = 0x10;
  featureLimitTable[0xf].name._4_4_ = 0;
  featureLimitTable[0xf].uintVal = 0;
  featureLimitTable[0xf].intVal = 0;
  featureLimitTable[0xf].deviceSizeVal._0_4_ = 0;
  featureLimitTable[0xf].deviceSizeVal._4_4_ = 1;
  featureLimitTable[0xf].floatVal = 0.0;
  featureLimitTable[0xf].format = ~LIMIT_FORMAT_SIGNED_INT;
  featureLimitTable[0xf].type = 0x48;
  featureLimitTable[0x10]._0_8_ = anon_var_dwarf_1de47d;
  featureLimitTable[0x10].name._0_4_ = 0xc;
  featureLimitTable[0x10].name._4_4_ = 0;
  featureLimitTable[0x10].uintVal = 0;
  featureLimitTable[0x10].intVal = 0;
  featureLimitTable[0x10].deviceSizeVal._0_4_ = 0;
  featureLimitTable[0x10].deviceSizeVal._4_4_ = 1;
  featureLimitTable[0x10].floatVal = 0.0;
  featureLimitTable[0x10].format = ~LIMIT_FORMAT_SIGNED_INT;
  featureLimitTable[0x10].type = 0x4c;
  featureLimitTable[0x11]._0_8_ = anon_var_dwarf_1de487;
  featureLimitTable[0x11].name._0_4_ = 4;
  featureLimitTable[0x11].name._4_4_ = 0;
  featureLimitTable[0x11].uintVal = 0;
  featureLimitTable[0x11].intVal = 0;
  featureLimitTable[0x11].deviceSizeVal._0_4_ = 0;
  featureLimitTable[0x11].deviceSizeVal._4_4_ = 1;
  featureLimitTable[0x11].floatVal = 0.0;
  featureLimitTable[0x11].format = ~LIMIT_FORMAT_SIGNED_INT;
  featureLimitTable[0x11].type = 0x50;
  featureLimitTable[0x12]._0_8_ = anon_var_dwarf_1de491;
  featureLimitTable[0x12].name._0_4_ = 0x10;
  featureLimitTable[0x12].name._4_4_ = 0;
  featureLimitTable[0x12].uintVal = 0;
  featureLimitTable[0x12].intVal = 0;
  featureLimitTable[0x12].deviceSizeVal._0_4_ = 0;
  featureLimitTable[0x12].deviceSizeVal._4_4_ = 1;
  featureLimitTable[0x12].floatVal = 0.0;
  featureLimitTable[0x12].format = ~LIMIT_FORMAT_SIGNED_INT;
  featureLimitTable[0x12].type = 0x54;
  featureLimitTable[0x13]._0_8_ = anon_var_dwarf_1de49b;
  featureLimitTable[0x13].name._0_4_ = 4;
  featureLimitTable[0x13].name._4_4_ = 0;
  featureLimitTable[0x13].uintVal = 0;
  featureLimitTable[0x13].intVal = 0;
  featureLimitTable[0x13].deviceSizeVal._0_4_ = 0;
  featureLimitTable[0x13].deviceSizeVal._4_4_ = 1;
  featureLimitTable[0x13].floatVal = 0.0;
  featureLimitTable[0x13].format = ~LIMIT_FORMAT_SIGNED_INT;
  featureLimitTable[0x13].type = 0x58;
  featureLimitTable[0x14]._0_8_ = anon_var_dwarf_1de4a5;
  featureLimitTable[0x14].name._0_4_ = 4;
  featureLimitTable[0x14].name._4_4_ = 0;
  featureLimitTable[0x14].uintVal = 0;
  featureLimitTable[0x14].intVal = 0;
  featureLimitTable[0x14].deviceSizeVal._0_4_ = 0;
  featureLimitTable[0x14].deviceSizeVal._4_4_ = 1;
  featureLimitTable[0x14].floatVal = 0.0;
  featureLimitTable[0x14].format = ~LIMIT_FORMAT_SIGNED_INT;
  featureLimitTable[0x14].type = 0x5c;
  featureLimitTable[0x15]._0_8_ = anon_var_dwarf_1de4af;
  featureLimitTable[0x15].name._0_4_ = 0;
  featureLimitTable[0x15].name._4_4_ = 0;
  featureLimitTable[0x15].uintVal = 0;
  featureLimitTable[0x15].intVal = 0;
  featureLimitTable[0x15].deviceSizeVal._0_4_ = 0;
  featureLimitTable[0x15].deviceSizeVal._4_4_ = 1;
  featureLimitTable[0x15].floatVal = 2.8026e-45;
  featureLimitTable[0x15].format = ~LIMIT_FORMAT_SIGNED_INT;
  featureLimitTable[0x15].type = 0x60;
  featureLimitTable[0x16]._0_8_ = anon_var_dwarf_1de4b9;
  featureLimitTable[0x16].name._0_4_ = 0x60;
  featureLimitTable[0x16].name._4_4_ = 0;
  featureLimitTable[0x16].uintVal = 0;
  featureLimitTable[0x16].intVal = 0;
  featureLimitTable[0x16].deviceSizeVal._0_4_ = 0;
  featureLimitTable[0x16].deviceSizeVal._4_4_ = 1;
  featureLimitTable[0x16].floatVal = 0.0;
  featureLimitTable[0x16].format = ~LIMIT_FORMAT_SIGNED_INT;
  featureLimitTable[0x16].type = 100;
  featureLimitTable[0x17]._0_8_ = anon_var_dwarf_1de4c3;
  featureLimitTable[0x17].name._0_4_ = 0x48;
  featureLimitTable[0x17].name._4_4_ = 0;
  featureLimitTable[0x17].uintVal = 0;
  featureLimitTable[0x17].intVal = 0;
  featureLimitTable[0x17].deviceSizeVal._0_4_ = 0;
  featureLimitTable[0x17].deviceSizeVal._4_4_ = 1;
  featureLimitTable[0x17].floatVal = 0.0;
  featureLimitTable[0x17].format = ~LIMIT_FORMAT_SIGNED_INT;
  featureLimitTable[0x17].type = 0x68;
  featureLimitTable[0x18]._0_8_ = anon_var_dwarf_1de4cd;
  featureLimitTable[0x18].name._0_4_ = 8;
  featureLimitTable[0x18].name._4_4_ = 0;
  featureLimitTable[0x18].uintVal = 0;
  featureLimitTable[0x18].intVal = 0;
  featureLimitTable[0x18].deviceSizeVal._0_4_ = 0;
  featureLimitTable[0x18].deviceSizeVal._4_4_ = 1;
  featureLimitTable[0x18].floatVal = 0.0;
  featureLimitTable[0x18].format = ~LIMIT_FORMAT_SIGNED_INT;
  featureLimitTable[0x18].type = 0x6c;
  featureLimitTable[0x19]._0_8_ = anon_var_dwarf_1de4d7;
  featureLimitTable[0x19].name._0_4_ = 0x18;
  featureLimitTable[0x19].name._4_4_ = 0;
  featureLimitTable[0x19].uintVal = 0;
  featureLimitTable[0x19].intVal = 0;
  featureLimitTable[0x19].deviceSizeVal._0_4_ = 0;
  featureLimitTable[0x19].deviceSizeVal._4_4_ = 1;
  featureLimitTable[0x19].floatVal = 0.0;
  featureLimitTable[0x19].format = ~LIMIT_FORMAT_SIGNED_INT;
  featureLimitTable[0x19].type = 0x70;
  featureLimitTable[0x1a]._0_8_ = anon_var_dwarf_1de4e1;
  featureLimitTable[0x1a].name._0_4_ = 4;
  featureLimitTable[0x1a].name._4_4_ = 0;
  featureLimitTable[0x1a].uintVal = 0;
  featureLimitTable[0x1a].intVal = 0;
  featureLimitTable[0x1a].deviceSizeVal._0_4_ = 0;
  featureLimitTable[0x1a].deviceSizeVal._4_4_ = 1;
  featureLimitTable[0x1a].floatVal = 0.0;
  featureLimitTable[0x1a].format = ~LIMIT_FORMAT_SIGNED_INT;
  featureLimitTable[0x1a].type = 0x74;
  featureLimitTable[0x1b]._0_8_ = anon_var_dwarf_1de4eb;
  featureLimitTable[0x1b].name._0_4_ = 0x60;
  featureLimitTable[0x1b].name._4_4_ = 0;
  featureLimitTable[0x1b].uintVal = 0;
  featureLimitTable[0x1b].intVal = 0;
  featureLimitTable[0x1b].deviceSizeVal._0_4_ = 0;
  featureLimitTable[0x1b].deviceSizeVal._4_4_ = 1;
  featureLimitTable[0x1b].floatVal = 0.0;
  featureLimitTable[0x1b].format = ~LIMIT_FORMAT_SIGNED_INT;
  featureLimitTable[0x1b].type = 0x78;
  featureLimitTable[0x1c]._0_8_ = anon_var_dwarf_1de4f5;
  featureLimitTable[0x1c].name._0_4_ = 0x18;
  featureLimitTable[0x1c].name._4_4_ = 0;
  featureLimitTable[0x1c].uintVal = 0;
  featureLimitTable[0x1c].intVal = 0;
  featureLimitTable[0x1c].deviceSizeVal._0_4_ = 0;
  featureLimitTable[0x1c].deviceSizeVal._4_4_ = 1;
  featureLimitTable[0x1c].floatVal = 0.0;
  featureLimitTable[0x1c].format = ~LIMIT_FORMAT_SIGNED_INT;
  featureLimitTable[0x1c].type = 0x7c;
  featureLimitTable[0x1d]._0_8_ = anon_var_dwarf_1de4ff;
  featureLimitTable[0x1d].name._0_4_ = 0;
  featureLimitTable[0x1d].name._4_4_ = 0;
  featureLimitTable[0x1d].uintVal = 0;
  featureLimitTable[0x1d].intVal = 0;
  featureLimitTable[0x1d].deviceSizeVal._0_4_ = 0;
  featureLimitTable[0x1d].deviceSizeVal._4_4_ = 1;
  featureLimitTable[0x1d].floatVal = 2.8026e-45;
  featureLimitTable[0x1d].format = ~LIMIT_FORMAT_SIGNED_INT;
  featureLimitTable[0x1d].type = 0x80;
  featureLimitTable[0x1e]._0_8_ = anon_var_dwarf_1de509;
  featureLimitTable[0x1e].name._0_4_ = 0x10;
  featureLimitTable[0x1e].name._4_4_ = 0;
  featureLimitTable[0x1e].uintVal = 0;
  featureLimitTable[0x1e].intVal = 0;
  featureLimitTable[0x1e].deviceSizeVal._0_4_ = 0;
  featureLimitTable[0x1e].deviceSizeVal._4_4_ = 1;
  featureLimitTable[0x1e].floatVal = 0.0;
  featureLimitTable[0x1e].format = ~LIMIT_FORMAT_SIGNED_INT;
  featureLimitTable[0x1e].type = 0x84;
  featureLimitTable[0x1f]._0_8_ = anon_var_dwarf_1de513;
  featureLimitTable[0x1f].name._0_4_ = 0x10;
  featureLimitTable[0x1f].name._4_4_ = 0;
  featureLimitTable[0x1f].uintVal = 0;
  featureLimitTable[0x1f].intVal = 0;
  featureLimitTable[0x1f].deviceSizeVal._0_4_ = 0;
  featureLimitTable[0x1f].deviceSizeVal._4_4_ = 1;
  featureLimitTable[0x1f].floatVal = 0.0;
  featureLimitTable[0x1f].format = ~LIMIT_FORMAT_SIGNED_INT;
  featureLimitTable[0x1f].type = 0x88;
  featureLimitTable[0x20]._0_8_ = anon_var_dwarf_1de51d;
  featureLimitTable[0x20].name._0_4_ = 0x7ff;
  featureLimitTable[0x20].name._4_4_ = 0;
  featureLimitTable[0x20].uintVal = 0;
  featureLimitTable[0x20].intVal = 0;
  featureLimitTable[0x20].deviceSizeVal._0_4_ = 0;
  featureLimitTable[0x20].deviceSizeVal._4_4_ = 1;
  featureLimitTable[0x20].floatVal = 0.0;
  featureLimitTable[0x20].format = ~LIMIT_FORMAT_SIGNED_INT;
  featureLimitTable[0x20].type = 0x8c;
  featureLimitTable[0x21]._0_8_ = anon_var_dwarf_1de527;
  featureLimitTable[0x21].name._0_4_ = 0x800;
  featureLimitTable[0x21].name._4_4_ = 0;
  featureLimitTable[0x21].uintVal = 0;
  featureLimitTable[0x21].intVal = 0;
  featureLimitTable[0x21].deviceSizeVal._0_4_ = 0;
  featureLimitTable[0x21].deviceSizeVal._4_4_ = 1;
  featureLimitTable[0x21].floatVal = 0.0;
  featureLimitTable[0x21].format = ~LIMIT_FORMAT_SIGNED_INT;
  featureLimitTable[0x21].type = 0x90;
  featureLimitTable[0x22]._0_8_ = anon_var_dwarf_1de53d;
  featureLimitTable[0x22].name._0_4_ = 0x40;
  featureLimitTable[0x22].name._4_4_ = 0;
  featureLimitTable[0x22].uintVal = 0;
  featureLimitTable[0x22].intVal = 0;
  featureLimitTable[0x22].deviceSizeVal._0_4_ = 0;
  featureLimitTable[0x22].deviceSizeVal._4_4_ = 1;
  featureLimitTable[0x22].floatVal = 0.0;
  featureLimitTable[0x22].format = ~LIMIT_FORMAT_SIGNED_INT;
  featureLimitTable[0x22].type = 0x94;
  featureLimitTable[0x23]._0_8_ = anon_var_dwarf_1de547;
  featureLimitTable[0x23].name._0_4_ = 0x40;
  featureLimitTable[0x23].name._4_4_ = 0;
  featureLimitTable[0x23].uintVal = 0;
  featureLimitTable[0x23].intVal = 0;
  featureLimitTable[0x23].deviceSizeVal._0_4_ = 0;
  featureLimitTable[0x23].deviceSizeVal._4_4_ = 1;
  featureLimitTable[0x23].floatVal = 0.0;
  featureLimitTable[0x23].format = ~LIMIT_FORMAT_SIGNED_INT;
  featureLimitTable[0x23].type = 0x98;
  featureLimitTable[0x24]._0_8_ = anon_var_dwarf_1de551;
  featureLimitTable[0x24].name._0_4_ = 0x20;
  featureLimitTable[0x24].name._4_4_ = 0;
  featureLimitTable[0x24].uintVal = 0;
  featureLimitTable[0x24].intVal = 0;
  featureLimitTable[0x24].deviceSizeVal._0_4_ = 0;
  featureLimitTable[0x24].deviceSizeVal._4_4_ = 1;
  featureLimitTable[0x24].floatVal = 0.0;
  featureLimitTable[0x24].format = ~LIMIT_FORMAT_SIGNED_INT;
  featureLimitTable[0x24].type = 0x9c;
  featureLimitTable[0x25]._0_8_ = anon_var_dwarf_1de55b;
  featureLimitTable[0x25].name._0_4_ = 0x40;
  featureLimitTable[0x25].name._4_4_ = 0;
  featureLimitTable[0x25].uintVal = 0;
  featureLimitTable[0x25].intVal = 0;
  featureLimitTable[0x25].deviceSizeVal._0_4_ = 0;
  featureLimitTable[0x25].deviceSizeVal._4_4_ = 1;
  featureLimitTable[0x25].floatVal = 0.0;
  featureLimitTable[0x25].format = ~LIMIT_FORMAT_SIGNED_INT;
  featureLimitTable[0x25].type = 0xa0;
  featureLimitTable[0x26]._0_8_ = anon_var_dwarf_1de565;
  featureLimitTable[0x26].name._0_4_ = 0x40;
  featureLimitTable[0x26].name._4_4_ = 0;
  featureLimitTable[0x26].uintVal = 0;
  featureLimitTable[0x26].intVal = 0;
  featureLimitTable[0x26].deviceSizeVal._0_4_ = 0;
  featureLimitTable[0x26].deviceSizeVal._4_4_ = 1;
  featureLimitTable[0x26].floatVal = 0.0;
  featureLimitTable[0x26].format = ~LIMIT_FORMAT_SIGNED_INT;
  featureLimitTable[0x26].type = 0xa4;
  featureLimitTable[0x27]._0_8_ = anon_var_dwarf_1de57b;
  featureLimitTable[0x27].name._0_4_ = 0x78;
  featureLimitTable[0x27].name._4_4_ = 0;
  featureLimitTable[0x27].uintVal = 0;
  featureLimitTable[0x27].intVal = 0;
  featureLimitTable[0x27].deviceSizeVal._0_4_ = 0;
  featureLimitTable[0x27].deviceSizeVal._4_4_ = 1;
  featureLimitTable[0x27].floatVal = 0.0;
  featureLimitTable[0x27].format = ~LIMIT_FORMAT_SIGNED_INT;
  featureLimitTable[0x27].type = 0xa8;
  featureLimitTable[0x28]._0_8_ = anon_var_dwarf_1de585;
  featureLimitTable[0x28].name._0_4_ = 0x800;
  featureLimitTable[0x28].name._4_4_ = 0;
  featureLimitTable[0x28].uintVal = 0;
  featureLimitTable[0x28].intVal = 0;
  featureLimitTable[0x28].deviceSizeVal._0_4_ = 0;
  featureLimitTable[0x28].deviceSizeVal._4_4_ = 1;
  featureLimitTable[0x28].floatVal = 0.0;
  featureLimitTable[0x28].format = ~LIMIT_FORMAT_SIGNED_INT;
  featureLimitTable[0x28].type = 0xac;
  featureLimitTable[0x29]._0_8_ = anon_var_dwarf_1de58f;
  featureLimitTable[0x29].name._0_4_ = 0x40;
  featureLimitTable[0x29].name._4_4_ = 0;
  featureLimitTable[0x29].uintVal = 0;
  featureLimitTable[0x29].intVal = 0;
  featureLimitTable[0x29].deviceSizeVal._0_4_ = 0;
  featureLimitTable[0x29].deviceSizeVal._4_4_ = 1;
  featureLimitTable[0x29].floatVal = 0.0;
  featureLimitTable[0x29].format = ~LIMIT_FORMAT_SIGNED_INT;
  featureLimitTable[0x29].type = 0xb0;
  featureLimitTable[0x2a]._0_8_ = anon_var_dwarf_1de59a;
  featureLimitTable[0x2a].name._0_4_ = 0x40;
  featureLimitTable[0x2a].name._4_4_ = 0;
  featureLimitTable[0x2a].uintVal = 0;
  featureLimitTable[0x2a].intVal = 0;
  featureLimitTable[0x2a].deviceSizeVal._0_4_ = 0;
  featureLimitTable[0x2a].deviceSizeVal._4_4_ = 1;
  featureLimitTable[0x2a].floatVal = 0.0;
  featureLimitTable[0x2a].format = ~LIMIT_FORMAT_SIGNED_INT;
  featureLimitTable[0x2a].type = 0xb4;
  featureLimitTable[0x2b]._0_8_ = anon_var_dwarf_1de5b1;
  featureLimitTable[0x2b].name._0_4_ = 0x20;
  featureLimitTable[0x2b].name._4_4_ = 0;
  featureLimitTable[0x2b].uintVal = 0;
  featureLimitTable[0x2b].intVal = 0;
  featureLimitTable[0x2b].deviceSizeVal._0_4_ = 0;
  featureLimitTable[0x2b].deviceSizeVal._4_4_ = 1;
  featureLimitTable[0x2b].floatVal = 0.0;
  featureLimitTable[0x2b].format = ~LIMIT_FORMAT_SIGNED_INT;
  featureLimitTable[0x2b].type = 0xb8;
  featureLimitTable[0x2c]._0_8_ = anon_var_dwarf_1de5c8;
  featureLimitTable[0x2c].name._0_4_ = 0x40;
  featureLimitTable[0x2c].name._4_4_ = 0;
  featureLimitTable[0x2c].uintVal = 0;
  featureLimitTable[0x2c].intVal = 0;
  featureLimitTable[0x2c].deviceSizeVal._0_4_ = 0;
  featureLimitTable[0x2c].deviceSizeVal._4_4_ = 1;
  featureLimitTable[0x2c].floatVal = 0.0;
  featureLimitTable[0x2c].format = ~LIMIT_FORMAT_SIGNED_INT;
  featureLimitTable[0x2c].type = 0xbc;
  featureLimitTable[0x2d]._0_8_ = anon_var_dwarf_1de5d3;
  featureLimitTable[0x2d].name._0_4_ = 0x40;
  featureLimitTable[0x2d].name._4_4_ = 0;
  featureLimitTable[0x2d].uintVal = 0;
  featureLimitTable[0x2d].intVal = 0;
  featureLimitTable[0x2d].deviceSizeVal._0_4_ = 0;
  featureLimitTable[0x2d].deviceSizeVal._4_4_ = 1;
  featureLimitTable[0x2d].floatVal = 0.0;
  featureLimitTable[0x2d].format = ~LIMIT_FORMAT_SIGNED_INT;
  featureLimitTable[0x2d].type = 0xc0;
  featureLimitTable[0x2e]._0_8_ = anon_var_dwarf_1de5de;
  featureLimitTable[0x2e].name._0_4_ = 0x100;
  featureLimitTable[0x2e].name._4_4_ = 0;
  featureLimitTable[0x2e].uintVal = 0;
  featureLimitTable[0x2e].intVal = 0;
  featureLimitTable[0x2e].deviceSizeVal._0_4_ = 0;
  featureLimitTable[0x2e].deviceSizeVal._4_4_ = 1;
  featureLimitTable[0x2e].floatVal = 0.0;
  featureLimitTable[0x2e].format = ~LIMIT_FORMAT_SIGNED_INT;
  featureLimitTable[0x2e].type = 0xc4;
  featureLimitTable[0x2f]._0_8_ = anon_var_dwarf_1de5e9;
  featureLimitTable[0x2f].name._0_4_ = 0x400;
  featureLimitTable[0x2f].name._4_4_ = 0;
  featureLimitTable[0x2f].uintVal = 0;
  featureLimitTable[0x2f].intVal = 0;
  featureLimitTable[0x2f].deviceSizeVal._0_4_ = 0;
  featureLimitTable[0x2f].deviceSizeVal._4_4_ = 1;
  featureLimitTable[0x2f].floatVal = 0.0;
  featureLimitTable[0x2f].format = ~LIMIT_FORMAT_SIGNED_INT;
  featureLimitTable[0x2f].type = 200;
  featureLimitTable[0x30]._0_8_ = anon_var_dwarf_1de5f4;
  featureLimitTable[0x30].name._0_4_ = 0x40;
  featureLimitTable[0x30].name._4_4_ = 0;
  featureLimitTable[0x30].uintVal = 0;
  featureLimitTable[0x30].intVal = 0;
  featureLimitTable[0x30].deviceSizeVal._0_4_ = 0;
  featureLimitTable[0x30].deviceSizeVal._4_4_ = 1;
  featureLimitTable[0x30].floatVal = 0.0;
  featureLimitTable[0x30].format = ~LIMIT_FORMAT_SIGNED_INT;
  featureLimitTable[0x30].type = 0xcc;
  featureLimitTable[0x31]._0_8_ = anon_var_dwarf_1de5ff;
  featureLimitTable[0x31].name._0_4_ = 4;
  featureLimitTable[0x31].name._4_4_ = 0;
  featureLimitTable[0x31].uintVal = 0;
  featureLimitTable[0x31].intVal = 0;
  featureLimitTable[0x31].deviceSizeVal._0_4_ = 0;
  featureLimitTable[0x31].deviceSizeVal._4_4_ = 1;
  featureLimitTable[0x31].floatVal = 0.0;
  featureLimitTable[0x31].format = ~LIMIT_FORMAT_SIGNED_INT;
  featureLimitTable[0x31].type = 0xd0;
  featureLimitTable[0x32]._0_8_ = anon_var_dwarf_1de60a;
  featureLimitTable[0x32].name._0_4_ = 1;
  featureLimitTable[0x32].name._4_4_ = 0;
  featureLimitTable[0x32].uintVal = 0;
  featureLimitTable[0x32].intVal = 0;
  featureLimitTable[0x32].deviceSizeVal._0_4_ = 0;
  featureLimitTable[0x32].deviceSizeVal._4_4_ = 1;
  featureLimitTable[0x32].floatVal = 0.0;
  featureLimitTable[0x32].format = ~LIMIT_FORMAT_SIGNED_INT;
  featureLimitTable[0x32].type = 0xd4;
  featureLimitTable[0x33]._0_8_ = anon_var_dwarf_1de615;
  featureLimitTable[0x33].name._0_4_ = 4;
  featureLimitTable[0x33].name._4_4_ = 0;
  featureLimitTable[0x33].uintVal = 0;
  featureLimitTable[0x33].intVal = 0;
  featureLimitTable[0x33].deviceSizeVal._0_4_ = 0;
  featureLimitTable[0x33].deviceSizeVal._4_4_ = 1;
  featureLimitTable[0x33].floatVal = 0.0;
  featureLimitTable[0x33].format = ~LIMIT_FORMAT_SIGNED_INT;
  featureLimitTable[0x33].type = 0xd8;
  featureLimitTable[0x34]._0_8_ = anon_var_dwarf_1de620;
  featureLimitTable[0x34].name._0_4_ = 0x4000;
  featureLimitTable[0x34].name._4_4_ = 0;
  featureLimitTable[0x34].uintVal = 0;
  featureLimitTable[0x34].intVal = 0;
  featureLimitTable[0x34].deviceSizeVal._0_4_ = 0;
  featureLimitTable[0x34].deviceSizeVal._4_4_ = 1;
  featureLimitTable[0x34].floatVal = 0.0;
  featureLimitTable[0x34].format = ~LIMIT_FORMAT_SIGNED_INT;
  featureLimitTable[0x34].type = 0xdc;
  featureLimitTable[0x35]._0_8_ = anon_var_dwarf_1de62b;
  featureLimitTable[0x35].name._0_4_ = 0xffff;
  featureLimitTable[0x35].name._4_4_ = 0;
  featureLimitTable[0x35].uintVal = 0;
  featureLimitTable[0x35].intVal = 0;
  featureLimitTable[0x35].deviceSizeVal._0_4_ = 0;
  featureLimitTable[0x35].deviceSizeVal._4_4_ = 1;
  featureLimitTable[0x35].floatVal = 0.0;
  featureLimitTable[0x35].format = ~LIMIT_FORMAT_SIGNED_INT;
  featureLimitTable[0x35].type = 0xe0;
  featureLimitTable[0x36]._0_8_ = anon_var_dwarf_1de636;
  featureLimitTable[0x36].name._0_4_ = 0xffff;
  featureLimitTable[0x36].name._4_4_ = 0;
  featureLimitTable[0x36].uintVal = 0;
  featureLimitTable[0x36].intVal = 0;
  featureLimitTable[0x36].deviceSizeVal._0_4_ = 0;
  featureLimitTable[0x36].deviceSizeVal._4_4_ = 1;
  featureLimitTable[0x36].floatVal = 0.0;
  featureLimitTable[0x36].format = ~LIMIT_FORMAT_SIGNED_INT;
  featureLimitTable[0x36].type = 0xe4;
  featureLimitTable[0x37]._0_8_ = anon_var_dwarf_1de641;
  featureLimitTable[0x37].name._0_4_ = 0xffff;
  featureLimitTable[0x37].name._4_4_ = 0;
  featureLimitTable[0x37].uintVal = 0;
  featureLimitTable[0x37].intVal = 0;
  featureLimitTable[0x37].deviceSizeVal._0_4_ = 0;
  featureLimitTable[0x37].deviceSizeVal._4_4_ = 1;
  featureLimitTable[0x37].floatVal = 0.0;
  featureLimitTable[0x37].format = ~LIMIT_FORMAT_SIGNED_INT;
  featureLimitTable[0x37].type = 0xe8;
  featureLimitTable[0x38]._0_8_ = anon_var_dwarf_1de64c;
  featureLimitTable[0x38].name._0_4_ = 0x80;
  featureLimitTable[0x38].name._4_4_ = 0;
  featureLimitTable[0x38].uintVal = 0;
  featureLimitTable[0x38].intVal = 0;
  featureLimitTable[0x38].deviceSizeVal._0_4_ = 0;
  featureLimitTable[0x38].deviceSizeVal._4_4_ = 1;
  featureLimitTable[0x38].floatVal = 0.0;
  featureLimitTable[0x38].format = ~LIMIT_FORMAT_SIGNED_INT;
  featureLimitTable[0x38].type = 0xec;
  featureLimitTable[0x39]._0_8_ = anon_var_dwarf_1de657;
  featureLimitTable[0x39].name._0_4_ = 0x80;
  featureLimitTable[0x39].name._4_4_ = 0;
  featureLimitTable[0x39].uintVal = 0;
  featureLimitTable[0x39].intVal = 0;
  featureLimitTable[0x39].deviceSizeVal._0_4_ = 0;
  featureLimitTable[0x39].deviceSizeVal._4_4_ = 1;
  featureLimitTable[0x39].floatVal = 0.0;
  featureLimitTable[0x39].format = ~LIMIT_FORMAT_SIGNED_INT;
  featureLimitTable[0x39].type = 0xf0;
  featureLimitTable[0x3a]._0_8_ = anon_var_dwarf_1de662;
  featureLimitTable[0x3a].name._0_4_ = 0x80;
  featureLimitTable[0x3a].name._4_4_ = 0;
  featureLimitTable[0x3a].uintVal = 0;
  featureLimitTable[0x3a].intVal = 0;
  featureLimitTable[0x3a].deviceSizeVal._0_4_ = 0;
  featureLimitTable[0x3a].deviceSizeVal._4_4_ = 1;
  featureLimitTable[0x3a].floatVal = 0.0;
  featureLimitTable[0x3a].format = ~LIMIT_FORMAT_SIGNED_INT;
  featureLimitTable[0x3a].type = 0xf4;
  featureLimitTable[0x3b]._0_8_ = anon_var_dwarf_1de66d;
  featureLimitTable[0x3b].name._0_4_ = 0x40;
  featureLimitTable[0x3b].name._4_4_ = 0;
  featureLimitTable[0x3b].uintVal = 0;
  featureLimitTable[0x3b].intVal = 0;
  featureLimitTable[0x3b].deviceSizeVal._0_4_ = 0;
  featureLimitTable[0x3b].deviceSizeVal._4_4_ = 1;
  featureLimitTable[0x3b].floatVal = 0.0;
  featureLimitTable[0x3b].format = ~LIMIT_FORMAT_SIGNED_INT;
  featureLimitTable[0x3b].type = 0xf8;
  featureLimitTable[0x3c]._0_8_ = anon_var_dwarf_1de678;
  featureLimitTable[0x3c].name._0_4_ = 4;
  featureLimitTable[0x3c].name._4_4_ = 0;
  featureLimitTable[0x3c].uintVal = 0;
  featureLimitTable[0x3c].intVal = 0;
  featureLimitTable[0x3c].deviceSizeVal._0_4_ = 0;
  featureLimitTable[0x3c].deviceSizeVal._4_4_ = 1;
  featureLimitTable[0x3c].floatVal = 0.0;
  featureLimitTable[0x3c].format = ~LIMIT_FORMAT_SIGNED_INT;
  featureLimitTable[0x3c].type = 0xfc;
  featureLimitTable[0x3d]._0_8_ = anon_var_dwarf_1de683;
  featureLimitTable[0x3d].name._0_4_ = 4;
  featureLimitTable[0x3d].name._4_4_ = 0;
  featureLimitTable[0x3d].uintVal = 0;
  featureLimitTable[0x3d].intVal = 0;
  featureLimitTable[0x3d].deviceSizeVal._0_4_ = 0;
  featureLimitTable[0x3d].deviceSizeVal._4_4_ = 1;
  featureLimitTable[0x3d].floatVal = 0.0;
  featureLimitTable[0x3d].format = ~LIMIT_FORMAT_SIGNED_INT;
  featureLimitTable[0x3d].type = 0x100;
  featureLimitTable[0x3e]._0_8_ = anon_var_dwarf_1de68e;
  featureLimitTable[0x3e].name._0_4_ = 4;
  featureLimitTable[0x3e].name._4_4_ = 0;
  featureLimitTable[0x3e].uintVal = 0;
  featureLimitTable[0x3e].intVal = 0;
  featureLimitTable[0x3e].deviceSizeVal._0_4_ = 0;
  featureLimitTable[0x3e].deviceSizeVal._4_4_ = 1;
  featureLimitTable[0x3e].floatVal = 0.0;
  featureLimitTable[0x3e].format = ~LIMIT_FORMAT_SIGNED_INT;
  featureLimitTable[0x3e].type = 0x104;
  featureLimitTable[0x3f]._0_8_ = anon_var_dwarf_1de699;
  featureLimitTable[0x3f].name._0_4_ = 0xffffffff;
  featureLimitTable[0x3f].name._4_4_ = 0;
  featureLimitTable[0x3f].uintVal = 0;
  featureLimitTable[0x3f].intVal = 0;
  featureLimitTable[0x3f].deviceSizeVal._0_4_ = 0;
  featureLimitTable[0x3f].deviceSizeVal._4_4_ = 1;
  featureLimitTable[0x3f].floatVal = 0.0;
  featureLimitTable[0x3f].format = ~LIMIT_FORMAT_SIGNED_INT;
  featureLimitTable[0x3f].type = 0x108;
  featureLimitTable[0x40]._0_8_ = anon_var_dwarf_1de6a4;
  featureLimitTable[0x40].name._0_4_ = 0xffff;
  featureLimitTable[0x40].name._4_4_ = 0;
  featureLimitTable[0x40].uintVal = 0;
  featureLimitTable[0x40].intVal = 0;
  featureLimitTable[0x40].deviceSizeVal._0_4_ = 0;
  featureLimitTable[0x40].deviceSizeVal._4_4_ = 1;
  featureLimitTable[0x40].floatVal = 0.0;
  featureLimitTable[0x40].format = ~LIMIT_FORMAT_SIGNED_INT;
  featureLimitTable[0x40].type = 0x10c;
  featureLimitTable[0x41]._0_8_ = anon_var_dwarf_1de6af;
  featureLimitTable[0x41].name._0_4_ = 0;
  featureLimitTable[0x41].name._4_4_ = 0;
  featureLimitTable[0x41].uintVal = 0;
  featureLimitTable[0x41].intVal = 0;
  featureLimitTable[0x41].deviceSizeVal._0_4_ = 0x40000000;
  featureLimitTable[0x41].deviceSizeVal._4_4_ = 2;
  featureLimitTable[0x41].floatVal = 0.0;
  featureLimitTable[0x41].format = ~LIMIT_FORMAT_SIGNED_INT;
  featureLimitTable[0x41].type = 0x110;
  featureLimitTable[0x42]._0_8_ = anon_var_dwarf_1de6ba;
  featureLimitTable[0x42].name._0_4_ = 0;
  featureLimitTable[0x42].name._4_4_ = 0;
  featureLimitTable[0x42].uintVal = 0;
  featureLimitTable[0x42].intVal = 0;
  featureLimitTable[0x42].deviceSizeVal._0_4_ = 0x41800000;
  featureLimitTable[0x42].deviceSizeVal._4_4_ = 2;
  featureLimitTable[0x42].floatVal = 0.0;
  featureLimitTable[0x42].format = ~LIMIT_FORMAT_SIGNED_INT;
  featureLimitTable[0x42].type = 0x114;
  featureLimitTable[0x43]._0_8_ = anon_var_dwarf_1de6c5;
  featureLimitTable[0x43].name._0_4_ = 0x10;
  featureLimitTable[0x43].name._4_4_ = 0;
  featureLimitTable[0x43].uintVal = 0;
  featureLimitTable[0x43].intVal = 0;
  featureLimitTable[0x43].deviceSizeVal._0_4_ = 0;
  featureLimitTable[0x43].deviceSizeVal._4_4_ = 1;
  featureLimitTable[0x43].floatVal = 0.0;
  featureLimitTable[0x43].format = ~LIMIT_FORMAT_SIGNED_INT;
  featureLimitTable[0x43].type = 0x118;
  featureLimitTable[0x44]._0_8_ = anon_var_dwarf_1de6dc;
  featureLimitTable[0x44].name._0_4_ = 0x1000;
  featureLimitTable[0x44].name._4_4_ = 0;
  featureLimitTable[0x44].uintVal = 0;
  featureLimitTable[0x44].intVal = 0;
  featureLimitTable[0x44].deviceSizeVal._0_4_ = 0;
  featureLimitTable[0x44].deviceSizeVal._4_4_ = 1;
  featureLimitTable[0x44].floatVal = 0.0;
  featureLimitTable[0x44].format = ~LIMIT_FORMAT_SIGNED_INT;
  featureLimitTable[0x44].type = 0x11c;
  featureLimitTable[0x45]._0_8_ = anon_var_dwarf_1de6e7;
  featureLimitTable[0x45].name._0_4_ = 0x1000;
  featureLimitTable[0x45].name._4_4_ = 0;
  featureLimitTable[0x45].uintVal = 0;
  featureLimitTable[0x45].intVal = 0;
  featureLimitTable[0x45].deviceSizeVal._0_4_ = 0;
  featureLimitTable[0x45].deviceSizeVal._4_4_ = 1;
  featureLimitTable[0x45].floatVal = 0.0;
  featureLimitTable[0x45].format = ~LIMIT_FORMAT_SIGNED_INT;
  featureLimitTable[0x45].type = 0x120;
  featureLimitTable[0x46]._0_8_ = anon_var_dwarf_1de6f2;
  featureLimitTable[0x46].name._0_4_ = 0;
  featureLimitTable[0x46].name._4_4_ = 0;
  featureLimitTable[0x46].uintVal = 0;
  featureLimitTable[0x46].intVal = 0;
  featureLimitTable[0x46].deviceSizeVal._0_4_ = 0xc6000000;
  featureLimitTable[0x46].deviceSizeVal._4_4_ = 2;
  featureLimitTable[0x46].floatVal = 1.4013e-45;
  featureLimitTable[0x46].format = ~LIMIT_FORMAT_SIGNED_INT;
  featureLimitTable[0x46].type = 0x124;
  featureLimitTable[0x47]._0_8_ = anon_var_dwarf_1de6fd;
  featureLimitTable[0x47].name._0_4_ = 0;
  featureLimitTable[0x47].name._4_4_ = 0;
  featureLimitTable[0x47].uintVal = 0;
  featureLimitTable[0x47].intVal = 0;
  featureLimitTable[0x47].deviceSizeVal._0_4_ = 0x45fff800;
  featureLimitTable[0x47].deviceSizeVal._4_4_ = 2;
  featureLimitTable[0x47].floatVal = 0.0;
  featureLimitTable[0x47].format = ~LIMIT_FORMAT_SIGNED_INT;
  featureLimitTable[0x47].type = 0x128;
  featureLimitTable[0x48]._0_8_ = anon_var_dwarf_1de708;
  featureLimitTable[0x48].name._0_4_ = 0;
  featureLimitTable[0x48].name._4_4_ = 0;
  featureLimitTable[0x48].uintVal = 0;
  featureLimitTable[0x48].intVal = 0;
  featureLimitTable[0x48].deviceSizeVal._0_4_ = 0;
  featureLimitTable[0x48].deviceSizeVal._4_4_ = 1;
  featureLimitTable[0x48].floatVal = 0.0;
  featureLimitTable[0x48].format = ~LIMIT_FORMAT_SIGNED_INT;
  featureLimitTable[0x48].type = 0x130;
  featureLimitTable[0x49]._0_8_ = anon_var_dwarf_1de713;
  featureLimitTable[0x49].name._0_4_ = 0x40;
  featureLimitTable[0x49].name._4_4_ = 0;
  featureLimitTable[0x49].uintVal = 0;
  featureLimitTable[0x49].intVal = 0;
  featureLimitTable[0x49].deviceSizeVal._0_4_ = 0;
  featureLimitTable[0x49].deviceSizeVal._4_4_ = 1;
  featureLimitTable[0x49].floatVal = 0.0;
  featureLimitTable[0x49].format = ~LIMIT_FORMAT_SIGNED_INT;
  featureLimitTable[0x49].type = 0x138;
  featureLimitTable[0x4a]._0_8_ =
       (long)"VkMemoryRequirements alignment doesn\'t respect minTexelBufferOffsetAlignment" + 0x2f;
  featureLimitTable[0x4a].name._0_4_ = 0;
  featureLimitTable[0x4a].name._4_4_ = 0;
  featureLimitTable[0x4a].uintVal = 1;
  featureLimitTable[0x4a].intVal = 0;
  featureLimitTable[0x4a].deviceSizeVal._0_4_ = 0;
  featureLimitTable[0x4a].deviceSizeVal._4_4_ = 3;
  featureLimitTable[0x4a].floatVal = 0.0;
  featureLimitTable[0x4a].format = ~LIMIT_FORMAT_SIGNED_INT;
  featureLimitTable[0x4a].type = 0x138;
  featureLimitTable[0x4b]._0_8_ =
       (long)"VkMemoryRequirements alignment doesn\'t respect minTexelBufferOffsetAlignment" + 0x2f;
  featureLimitTable[0x4b].name._0_4_ = 0;
  featureLimitTable[0x4b].name._4_4_ = 0;
  featureLimitTable[0x4b].uintVal = 0x100;
  featureLimitTable[0x4b].intVal = 0;
  featureLimitTable[0x4b].deviceSizeVal._0_4_ = 0;
  featureLimitTable[0x4b].deviceSizeVal._4_4_ = 3;
  featureLimitTable[0x4b].floatVal = 1.4013e-45;
  featureLimitTable[0x4b].format = ~LIMIT_FORMAT_SIGNED_INT;
  featureLimitTable[0x4b].type = 0x140;
  featureLimitTable[0x4c]._0_8_ =
       (long)"VkMemoryRequirements alignment doesn\'t respect minUniformBufferOffsetAlignment" +
       0x2f;
  featureLimitTable[0x4c].name._0_4_ = 0;
  featureLimitTable[0x4c].name._4_4_ = 0;
  featureLimitTable[0x4c].uintVal = 1;
  featureLimitTable[0x4c].intVal = 0;
  featureLimitTable[0x4c].deviceSizeVal._0_4_ = 0;
  featureLimitTable[0x4c].deviceSizeVal._4_4_ = 3;
  featureLimitTable[0x4c].floatVal = 0.0;
  featureLimitTable[0x4c].format = ~LIMIT_FORMAT_SIGNED_INT;
  featureLimitTable[0x4c].type = 0x140;
  featureLimitTable[0x4d]._0_8_ =
       (long)"VkMemoryRequirements alignment doesn\'t respect minUniformBufferOffsetAlignment" +
       0x2f;
  featureLimitTable[0x4d].name._0_4_ = 0;
  featureLimitTable[0x4d].name._4_4_ = 0;
  featureLimitTable[0x4d].uintVal = 0x100;
  featureLimitTable[0x4d].intVal = 0;
  featureLimitTable[0x4d].deviceSizeVal._0_4_ = 0;
  featureLimitTable[0x4d].deviceSizeVal._4_4_ = 3;
  featureLimitTable[0x4d].floatVal = 1.4013e-45;
  featureLimitTable[0x4d].format = ~LIMIT_FORMAT_SIGNED_INT;
  featureLimitTable[0x4d].type = 0x148;
  featureLimitTable[0x4e]._0_8_ =
       (long)"VkMemoryRequirements alignment doesn\'t respect minStorageBufferOffsetAlignment" +
       0x2f;
  featureLimitTable[0x4e].name._0_4_ = 0;
  featureLimitTable[0x4e].name._4_4_ = 0;
  featureLimitTable[0x4e].uintVal = 1;
  featureLimitTable[0x4e].intVal = 0;
  featureLimitTable[0x4e].deviceSizeVal._0_4_ = 0;
  featureLimitTable[0x4e].deviceSizeVal._4_4_ = 3;
  featureLimitTable[0x4e].floatVal = 0.0;
  featureLimitTable[0x4e].format = ~LIMIT_FORMAT_SIGNED_INT;
  featureLimitTable[0x4e].type = 0x148;
  featureLimitTable[0x4f]._0_8_ =
       (long)"VkMemoryRequirements alignment doesn\'t respect minStorageBufferOffsetAlignment" +
       0x2f;
  featureLimitTable[0x4f].name._0_4_ = 0;
  featureLimitTable[0x4f].name._4_4_ = 0;
  featureLimitTable[0x4f].uintVal = 0x100;
  featureLimitTable[0x4f].intVal = 0;
  featureLimitTable[0x4f].deviceSizeVal._0_4_ = 0;
  featureLimitTable[0x4f].deviceSizeVal._4_4_ = 3;
  featureLimitTable[0x4f].floatVal = 1.4013e-45;
  featureLimitTable[0x4f].format = ~LIMIT_FORMAT_SIGNED_INT;
  featureLimitTable[0x4f].type = 0x150;
  featureLimitTable[0x50]._0_8_ = anon_var_dwarf_1de73f;
  featureLimitTable[0x50].name._0_4_ = 0;
  featureLimitTable[0x50].name._4_4_ = 0xfffffff8;
  featureLimitTable[0x50].uintVal = 0;
  featureLimitTable[0x50].intVal = 0;
  featureLimitTable[0x50].deviceSizeVal._0_4_ = 0;
  featureLimitTable[0x50].deviceSizeVal._4_4_ = 0;
  featureLimitTable[0x50].floatVal = 1.4013e-45;
  featureLimitTable[0x50].format = ~LIMIT_FORMAT_SIGNED_INT;
  featureLimitTable[0x50].type = 0x154;
  featureLimitTable[0x51]._0_8_ = anon_var_dwarf_1de74a;
  featureLimitTable[0x51].name._0_4_ = 7;
  featureLimitTable[0x51].name._4_4_ = 0;
  featureLimitTable[0x51].uintVal = 0;
  featureLimitTable[0x51].intVal = 0;
  featureLimitTable[0x51].deviceSizeVal._0_4_ = 0;
  featureLimitTable[0x51].deviceSizeVal._4_4_ = 1;
  featureLimitTable[0x51].floatVal = 0.0;
  featureLimitTable[0x51].format = ~LIMIT_FORMAT_SIGNED_INT;
  featureLimitTable[0x51].type = 0x158;
  featureLimitTable[0x52]._0_8_ = (long)"Implementation\'s value for minTexelGatherOffset" + 0x1b;
  featureLimitTable[0x52].name._0_4_ = 0;
  featureLimitTable[0x52].name._4_4_ = 0xfffffff8;
  featureLimitTable[0x52].uintVal = 0;
  featureLimitTable[0x52].intVal = 0;
  featureLimitTable[0x52].deviceSizeVal._0_4_ = 0;
  featureLimitTable[0x52].deviceSizeVal._4_4_ = 0;
  featureLimitTable[0x52].floatVal = 1.4013e-45;
  featureLimitTable[0x52].format = ~LIMIT_FORMAT_SIGNED_INT;
  featureLimitTable[0x52].type = 0x15c;
  featureLimitTable[0x53]._0_8_ = (long)"Implementation\'s value for maxTexelGatherOffset" + 0x1b;
  featureLimitTable[0x53].name._0_4_ = 7;
  featureLimitTable[0x53].name._4_4_ = 0;
  featureLimitTable[0x53].uintVal = 0;
  featureLimitTable[0x53].intVal = 0;
  featureLimitTable[0x53].deviceSizeVal._0_4_ = 0;
  featureLimitTable[0x53].deviceSizeVal._4_4_ = 1;
  featureLimitTable[0x53].floatVal = 0.0;
  featureLimitTable[0x53].format = ~LIMIT_FORMAT_SIGNED_INT;
  featureLimitTable[0x53].type = 0x160;
  featureLimitTable[0x54]._0_8_ = anon_var_dwarf_1de76b;
  featureLimitTable[0x54].name._0_4_ = 0;
  featureLimitTable[0x54].name._4_4_ = 0;
  featureLimitTable[0x54].uintVal = 0;
  featureLimitTable[0x54].intVal = 0;
  featureLimitTable[0x54].deviceSizeVal._0_4_ = 0xbf000000;
  featureLimitTable[0x54].deviceSizeVal._4_4_ = 2;
  featureLimitTable[0x54].floatVal = 1.4013e-45;
  featureLimitTable[0x54].format = ~LIMIT_FORMAT_SIGNED_INT;
  featureLimitTable[0x54].type = 0x164;
  featureLimitTable[0x55]._0_8_ = anon_var_dwarf_1de776;
  featureLimitTable[0x55].name._0_4_ = 0;
  featureLimitTable[0x55].name._4_4_ = 0;
  featureLimitTable[0x55].uintVal = 0;
  featureLimitTable[0x55].intVal = 0;
  fVar2 = deFloatPow(2.0,(float)(properties->limits).subPixelInterpolationOffsetBits);
  featureLimitTable[0x55].deviceSizeVal._0_4_ = -1.0 / fVar2 + 0.5;
  featureLimitTable[0x55].deviceSizeVal._4_4_ = 2;
  featureLimitTable[0x55].floatVal = 0.0;
  featureLimitTable[0x55].format = ~LIMIT_FORMAT_SIGNED_INT;
  featureLimitTable[0x55].type = 0x168;
  featureLimitTable[0x56]._0_8_ = anon_var_dwarf_1de781;
  featureLimitTable[0x56].name._0_4_ = 4;
  featureLimitTable[0x56].name._4_4_ = 0;
  featureLimitTable[0x56].uintVal = 0;
  featureLimitTable[0x56].intVal = 0;
  featureLimitTable[0x56].deviceSizeVal._0_4_ = 0;
  featureLimitTable[0x56].deviceSizeVal._4_4_ = 1;
  featureLimitTable[0x56].floatVal = 0.0;
  featureLimitTable[0x56].format = ~LIMIT_FORMAT_SIGNED_INT;
  featureLimitTable[0x56].type = 0x16c;
  featureLimitTable[0x57]._0_8_ = anon_var_dwarf_1de78c;
  featureLimitTable[0x57].name._0_4_ = 0x1000;
  featureLimitTable[0x57].name._4_4_ = 0;
  featureLimitTable[0x57].uintVal = 0;
  featureLimitTable[0x57].intVal = 0;
  featureLimitTable[0x57].deviceSizeVal._0_4_ = 0;
  featureLimitTable[0x57].deviceSizeVal._4_4_ = 1;
  featureLimitTable[0x57].floatVal = 0.0;
  featureLimitTable[0x57].format = ~LIMIT_FORMAT_SIGNED_INT;
  featureLimitTable[0x57].type = 0x170;
  featureLimitTable[0x58]._0_8_ =
       (long)
       "granularity.width <= m_context.getDeviceProperties().limits.maxFramebufferWidth && granularity.height <= m_context.getDeviceProperties().limits.maxFramebufferHeight"
       + 0x90;
  featureLimitTable[0x58].name._0_4_ = 0x1000;
  featureLimitTable[0x58].name._4_4_ = 0;
  featureLimitTable[0x58].uintVal = 0;
  featureLimitTable[0x58].intVal = 0;
  featureLimitTable[0x58].deviceSizeVal._0_4_ = 0;
  featureLimitTable[0x58].deviceSizeVal._4_4_ = 1;
  featureLimitTable[0x58].floatVal = 0.0;
  featureLimitTable[0x58].format = ~LIMIT_FORMAT_SIGNED_INT;
  featureLimitTable[0x58].type = 0x174;
  featureLimitTable[0x59]._0_8_ = anon_var_dwarf_1de7a2;
  featureLimitTable[0x59].name._0_4_ = 0;
  featureLimitTable[0x59].name._4_4_ = 0;
  featureLimitTable[0x59].uintVal = 0;
  featureLimitTable[0x59].intVal = 0;
  featureLimitTable[0x59].deviceSizeVal._0_4_ = 0;
  featureLimitTable[0x59].deviceSizeVal._4_4_ = 1;
  featureLimitTable[0x59].floatVal = 0.0;
  featureLimitTable[0x59].format = ~LIMIT_FORMAT_SIGNED_INT;
  featureLimitTable[0x59].type = 0x178;
  featureLimitTable[0x5a]._0_8_ = anon_var_dwarf_1de7ad;
  featureLimitTable[0x5a].name._0_4_ = 5;
  featureLimitTable[0x5a].name._4_4_ = 0;
  featureLimitTable[0x5a].uintVal = 0;
  featureLimitTable[0x5a].intVal = 0;
  featureLimitTable[0x5a].deviceSizeVal._0_4_ = 0;
  featureLimitTable[0x5a].deviceSizeVal._4_4_ = 4;
  featureLimitTable[0x5a].floatVal = 0.0;
  featureLimitTable[0x5a].format = ~LIMIT_FORMAT_SIGNED_INT;
  featureLimitTable[0x5a].type = 0x17c;
  featureLimitTable[0x5b]._0_8_ = anon_var_dwarf_1de7b8;
  featureLimitTable[0x5b].name._0_4_ = 5;
  featureLimitTable[0x5b].name._4_4_ = 0;
  featureLimitTable[0x5b].uintVal = 0;
  featureLimitTable[0x5b].intVal = 0;
  featureLimitTable[0x5b].deviceSizeVal._0_4_ = 0;
  featureLimitTable[0x5b].deviceSizeVal._4_4_ = 4;
  featureLimitTable[0x5b].floatVal = 0.0;
  featureLimitTable[0x5b].format = ~LIMIT_FORMAT_SIGNED_INT;
  featureLimitTable[0x5b].type = 0x180;
  featureLimitTable[0x5c]._0_8_ = anon_var_dwarf_1de7c3;
  featureLimitTable[0x5c].name._0_4_ = 5;
  featureLimitTable[0x5c].name._4_4_ = 0;
  featureLimitTable[0x5c].uintVal = 0;
  featureLimitTable[0x5c].intVal = 0;
  featureLimitTable[0x5c].deviceSizeVal._0_4_ = 0;
  featureLimitTable[0x5c].deviceSizeVal._4_4_ = 4;
  featureLimitTable[0x5c].floatVal = 0.0;
  featureLimitTable[0x5c].format = ~LIMIT_FORMAT_SIGNED_INT;
  featureLimitTable[0x5c].type = 0x184;
  featureLimitTable[0x5d]._0_8_ = anon_var_dwarf_1de7ce;
  featureLimitTable[0x5d].name._0_4_ = 5;
  featureLimitTable[0x5d].name._4_4_ = 0;
  featureLimitTable[0x5d].uintVal = 0;
  featureLimitTable[0x5d].intVal = 0;
  featureLimitTable[0x5d].deviceSizeVal._0_4_ = 0;
  featureLimitTable[0x5d].deviceSizeVal._4_4_ = 4;
  featureLimitTable[0x5d].floatVal = 0.0;
  featureLimitTable[0x5d].format = ~LIMIT_FORMAT_SIGNED_INT;
  featureLimitTable[0x5d].type = 0x188;
  featureLimitTable[0x5e]._0_8_ = anon_var_dwarf_1de7e5;
  featureLimitTable[0x5e].name._0_4_ = 4;
  featureLimitTable[0x5e].name._4_4_ = 0;
  featureLimitTable[0x5e].uintVal = 0;
  featureLimitTable[0x5e].intVal = 0;
  featureLimitTable[0x5e].deviceSizeVal._0_4_ = 0;
  featureLimitTable[0x5e].deviceSizeVal._4_4_ = 1;
  featureLimitTable[0x5e].floatVal = 0.0;
  featureLimitTable[0x5e].format = ~LIMIT_FORMAT_SIGNED_INT;
  featureLimitTable[0x5e].type = 0x18c;
  featureLimitTable[0x5f]._0_8_ = anon_var_dwarf_1de7f0;
  featureLimitTable[0x5f].name._0_4_ = 5;
  featureLimitTable[0x5f].name._4_4_ = 0;
  featureLimitTable[0x5f].uintVal = 0;
  featureLimitTable[0x5f].intVal = 0;
  featureLimitTable[0x5f].deviceSizeVal._0_4_ = 0;
  featureLimitTable[0x5f].deviceSizeVal._4_4_ = 4;
  featureLimitTable[0x5f].floatVal = 0.0;
  featureLimitTable[0x5f].format = ~LIMIT_FORMAT_SIGNED_INT;
  featureLimitTable[0x5f].type = 400;
  featureLimitTable[0x60]._0_8_ = anon_var_dwarf_1de7fb;
  featureLimitTable[0x60].name._0_4_ = 1;
  featureLimitTable[0x60].name._4_4_ = 0;
  featureLimitTable[0x60].uintVal = 0;
  featureLimitTable[0x60].intVal = 0;
  featureLimitTable[0x60].deviceSizeVal._0_4_ = 0;
  featureLimitTable[0x60].deviceSizeVal._4_4_ = 4;
  featureLimitTable[0x60].floatVal = 0.0;
  featureLimitTable[0x60].format = ~LIMIT_FORMAT_SIGNED_INT;
  featureLimitTable[0x60].type = 0x194;
  featureLimitTable[0x61]._0_8_ = anon_var_dwarf_1de806;
  featureLimitTable[0x61].name._0_4_ = 5;
  featureLimitTable[0x61].name._4_4_ = 0;
  featureLimitTable[0x61].uintVal = 0;
  featureLimitTable[0x61].intVal = 0;
  featureLimitTable[0x61].deviceSizeVal._0_4_ = 0;
  featureLimitTable[0x61].deviceSizeVal._4_4_ = 4;
  featureLimitTable[0x61].floatVal = 0.0;
  featureLimitTable[0x61].format = ~LIMIT_FORMAT_SIGNED_INT;
  featureLimitTable[0x61].type = 0x198;
  featureLimitTable[0x62]._0_8_ = anon_var_dwarf_1de811;
  featureLimitTable[0x62].name._0_4_ = 5;
  featureLimitTable[0x62].name._4_4_ = 0;
  featureLimitTable[0x62].uintVal = 0;
  featureLimitTable[0x62].intVal = 0;
  featureLimitTable[0x62].deviceSizeVal._0_4_ = 0;
  featureLimitTable[0x62].deviceSizeVal._4_4_ = 4;
  featureLimitTable[0x62].floatVal = 0.0;
  featureLimitTable[0x62].format = ~LIMIT_FORMAT_SIGNED_INT;
  featureLimitTable[0x62].type = 0x19c;
  featureLimitTable[99]._0_8_ = anon_var_dwarf_1de81c;
  featureLimitTable[99].name._0_4_ = 5;
  featureLimitTable[99].name._4_4_ = 0;
  featureLimitTable[99].uintVal = 0;
  featureLimitTable[99].intVal = 0;
  featureLimitTable[99].deviceSizeVal._0_4_ = 0;
  featureLimitTable[99].deviceSizeVal._4_4_ = 4;
  featureLimitTable[99].floatVal = 0.0;
  featureLimitTable[99].format = ~LIMIT_FORMAT_SIGNED_INT;
  featureLimitTable[99].type = 0x1a0;
  featureLimitTable[100]._0_8_ = anon_var_dwarf_1de827;
  featureLimitTable[100].name._0_4_ = 1;
  featureLimitTable[100].name._4_4_ = 0;
  featureLimitTable[100].uintVal = 0;
  featureLimitTable[100].intVal = 0;
  featureLimitTable[100].deviceSizeVal._0_4_ = 0;
  featureLimitTable[100].deviceSizeVal._4_4_ = 1;
  featureLimitTable[100].floatVal = 0.0;
  featureLimitTable[100].format = ~LIMIT_FORMAT_SIGNED_INT;
  featureLimitTable[100].type = 0x1a4;
  featureLimitTable[0x65]._0_8_ = anon_var_dwarf_1de832;
  featureLimitTable[0x65].name._0_4_ = 0;
  featureLimitTable[0x65].name._4_4_ = 0;
  featureLimitTable[0x65].uintVal = 0;
  featureLimitTable[0x65].intVal = 0;
  featureLimitTable[0x65].deviceSizeVal._0_4_ = 0;
  featureLimitTable[0x65].deviceSizeVal._4_4_ = 1;
  featureLimitTable[0x65].floatVal = 2.8026e-45;
  featureLimitTable[0x65].format = ~LIMIT_FORMAT_SIGNED_INT;
  featureLimitTable[0x65].type = 0x1a8;
  featureLimitTable[0x66]._0_8_ = anon_var_dwarf_1de83d;
  featureLimitTable[0x66].name._0_4_ = 0;
  featureLimitTable[0x66].name._4_4_ = 0;
  featureLimitTable[0x66].uintVal = 0;
  featureLimitTable[0x66].intVal = 0;
  featureLimitTable[0x66].deviceSizeVal._0_4_ = 0;
  featureLimitTable[0x66].deviceSizeVal._4_4_ = 1;
  featureLimitTable[0x66].floatVal = 2.8026e-45;
  featureLimitTable[0x66].format = ~LIMIT_FORMAT_SIGNED_INT;
  featureLimitTable[0x66].type = 0x1ac;
  featureLimitTable[0x67]._0_8_ = anon_var_dwarf_1de848;
  featureLimitTable[0x67].name._0_4_ = 8;
  featureLimitTable[0x67].name._4_4_ = 0;
  featureLimitTable[0x67].uintVal = 0;
  featureLimitTable[0x67].intVal = 0;
  featureLimitTable[0x67].deviceSizeVal._0_4_ = 0;
  featureLimitTable[0x67].deviceSizeVal._4_4_ = 1;
  featureLimitTable[0x67].floatVal = 0.0;
  featureLimitTable[0x67].format = ~LIMIT_FORMAT_SIGNED_INT;
  featureLimitTable[0x67].type = 0x1b0;
  featureLimitTable[0x68]._0_8_ = anon_var_dwarf_1de853;
  featureLimitTable[0x68].name._0_4_ = 8;
  featureLimitTable[0x68].name._4_4_ = 0;
  featureLimitTable[0x68].uintVal = 0;
  featureLimitTable[0x68].intVal = 0;
  featureLimitTable[0x68].deviceSizeVal._0_4_ = 0;
  featureLimitTable[0x68].deviceSizeVal._4_4_ = 1;
  featureLimitTable[0x68].floatVal = 0.0;
  featureLimitTable[0x68].format = ~LIMIT_FORMAT_SIGNED_INT;
  featureLimitTable[0x68].type = 0x1b4;
  featureLimitTable[0x69]._0_8_ = anon_var_dwarf_1de85e;
  featureLimitTable[0x69].name._0_4_ = 8;
  featureLimitTable[0x69].name._4_4_ = 0;
  featureLimitTable[0x69].uintVal = 0;
  featureLimitTable[0x69].intVal = 0;
  featureLimitTable[0x69].deviceSizeVal._0_4_ = 0;
  featureLimitTable[0x69].deviceSizeVal._4_4_ = 1;
  featureLimitTable[0x69].floatVal = 0.0;
  featureLimitTable[0x69].format = ~LIMIT_FORMAT_SIGNED_INT;
  featureLimitTable[0x69].type = 0x1b8;
  featureLimitTable[0x6a]._0_8_ = anon_var_dwarf_1de869;
  featureLimitTable[0x6a].name._0_4_ = 8;
  featureLimitTable[0x6a].name._4_4_ = 0;
  featureLimitTable[0x6a].uintVal = 0;
  featureLimitTable[0x6a].intVal = 0;
  featureLimitTable[0x6a].deviceSizeVal._0_4_ = 0;
  featureLimitTable[0x6a].deviceSizeVal._4_4_ = 1;
  featureLimitTable[0x6a].floatVal = 2.8026e-45;
  featureLimitTable[0x6a].format = ~LIMIT_FORMAT_SIGNED_INT;
  featureLimitTable[0x6a].type = 0x1bc;
  featureLimitTable[0x6b]._0_8_ = anon_var_dwarf_1de874;
  featureLimitTable[0x6b].name._0_4_ = 0;
  featureLimitTable[0x6b].name._4_4_ = 0;
  featureLimitTable[0x6b].uintVal = 0;
  featureLimitTable[0x6b].intVal = 0;
  featureLimitTable[0x6b].deviceSizeVal._0_4_ = 0;
  featureLimitTable[0x6b].deviceSizeVal._4_4_ = 2;
  featureLimitTable[0x6b].floatVal = 0.0;
  featureLimitTable[0x6b].format = ~LIMIT_FORMAT_SIGNED_INT;
  featureLimitTable[0x6b].type = 0x1bc;
  featureLimitTable[0x6c]._0_8_ = anon_var_dwarf_1de874;
  featureLimitTable[0x6c].name._0_4_ = 0;
  featureLimitTable[0x6c].name._4_4_ = 0;
  featureLimitTable[0x6c].uintVal = 0;
  featureLimitTable[0x6c].intVal = 0;
  featureLimitTable[0x6c].deviceSizeVal._0_4_ = 0x3f800000;
  featureLimitTable[0x6c].deviceSizeVal._4_4_ = 2;
  featureLimitTable[0x6c].floatVal = 1.4013e-45;
  featureLimitTable[0x6c].format = ~LIMIT_FORMAT_SIGNED_INT;
  featureLimitTable[0x6c].type = 0x1c0;
  featureLimitTable[0x6d]._0_8_ = anon_var_dwarf_1de87f;
  featureLimitTable[0x6d].name._0_4_ = 0;
  featureLimitTable[0x6d].name._4_4_ = 0;
  featureLimitTable[0x6d].uintVal = 0;
  featureLimitTable[0x6d].intVal = 0;
  featureLimitTable[0x6d].deviceSizeVal._0_4_ = 64.0 - (properties->limits).pointSizeGranularity;
  featureLimitTable[0x6d].deviceSizeVal._4_4_ = 2;
  featureLimitTable[0x6d].floatVal = 0.0;
  featureLimitTable[0x6d].format = ~LIMIT_FORMAT_SIGNED_INT;
  featureLimitTable[0x6d].type = 0x1c4;
  featureLimitTable[0x6e]._0_8_ = anon_var_dwarf_1de88a;
  featureLimitTable[0x6e].name._0_4_ = 0;
  featureLimitTable[0x6e].name._4_4_ = 0;
  featureLimitTable[0x6e].uintVal = 0;
  featureLimitTable[0x6e].intVal = 0;
  featureLimitTable[0x6e].deviceSizeVal._0_4_ = 0;
  featureLimitTable[0x6e].deviceSizeVal._4_4_ = 2;
  featureLimitTable[0x6e].floatVal = 0.0;
  featureLimitTable[0x6e].format = ~LIMIT_FORMAT_SIGNED_INT;
  featureLimitTable[0x6e].type = 0x1c4;
  featureLimitTable[0x6f]._0_8_ = anon_var_dwarf_1de88a;
  featureLimitTable[0x6f].name._0_4_ = 0;
  featureLimitTable[0x6f].name._4_4_ = 0;
  featureLimitTable[0x6f].uintVal = 0;
  featureLimitTable[0x6f].intVal = 0;
  featureLimitTable[0x6f].deviceSizeVal._0_4_ = 0x3f800000;
  featureLimitTable[0x6f].deviceSizeVal._4_4_ = 2;
  featureLimitTable[0x6f].floatVal = 1.4013e-45;
  featureLimitTable[0x6f].format = ~LIMIT_FORMAT_SIGNED_INT;
  featureLimitTable[0x6f].type = 0x1c8;
  featureLimitTable[0x70]._0_8_ = anon_var_dwarf_1de895;
  featureLimitTable[0x70].name._0_4_ = 0;
  featureLimitTable[0x70].name._4_4_ = 0;
  featureLimitTable[0x70].uintVal = 0;
  featureLimitTable[0x70].intVal = 0;
  featureLimitTable[0x70].deviceSizeVal._0_4_ = 8.0 - (properties->limits).lineWidthGranularity;
  featureLimitTable[0x70].deviceSizeVal._4_4_ = 2;
  featureLimitTable[0x70].floatVal = 0.0;
  featureLimitTable[0x70].format = ~LIMIT_FORMAT_SIGNED_INT;
  featureLimitTable[0x70].type = 0x1cc;
  featureLimitTable[0x71]._0_8_ = anon_var_dwarf_1de8a0;
  featureLimitTable[0x71].name._0_4_ = 0;
  featureLimitTable[0x71].name._4_4_ = 0;
  featureLimitTable[0x71].uintVal = 0;
  featureLimitTable[0x71].intVal = 0;
  featureLimitTable[0x71].deviceSizeVal._0_4_ = 0x3f800000;
  featureLimitTable[0x71].deviceSizeVal._4_4_ = 2;
  featureLimitTable[0x71].floatVal = 1.4013e-45;
  featureLimitTable[0x71].format = ~LIMIT_FORMAT_SIGNED_INT;
  featureLimitTable[0x71].type = 0x1d0;
  featureLimitTable[0x72]._0_8_ = anon_var_dwarf_1de8ab;
  featureLimitTable[0x72].name._0_4_ = 0;
  featureLimitTable[0x72].name._4_4_ = 0;
  featureLimitTable[0x72].uintVal = 0;
  featureLimitTable[0x72].intVal = 0;
  featureLimitTable[0x72].deviceSizeVal._0_4_ = 0x3f800000;
  featureLimitTable[0x72].deviceSizeVal._4_4_ = 2;
  featureLimitTable[0x72].floatVal = 1.4013e-45;
  featureLimitTable[0x72].format = ~LIMIT_FORMAT_SIGNED_INT;
  featureLimitTable[0x72].type = 0x1d4;
  featureLimitTable[0x73]._0_8_ = anon_var_dwarf_1de8b6;
  featureLimitTable[0x73].name._0_4_ = 0;
  featureLimitTable[0x73].name._4_4_ = 0;
  featureLimitTable[0x73].uintVal = 0;
  featureLimitTable[0x73].intVal = 0;
  featureLimitTable[0x73].deviceSizeVal._0_4_ = 0;
  featureLimitTable[0x73].deviceSizeVal._4_4_ = 1;
  featureLimitTable[0x73].floatVal = 2.8026e-45;
  featureLimitTable[0x73].format = ~LIMIT_FORMAT_SIGNED_INT;
  featureLimitTable[0x73].type = 0x1d8;
  featureLimitTable[0x74]._0_8_ = anon_var_dwarf_1de8cd;
  featureLimitTable[0x74].name._0_4_ = 0;
  featureLimitTable[0x74].name._4_4_ = 0;
  featureLimitTable[0x74].uintVal = 0;
  featureLimitTable[0x74].intVal = 0;
  featureLimitTable[0x74].deviceSizeVal._0_4_ = 0;
  featureLimitTable[0x74].deviceSizeVal._4_4_ = 1;
  featureLimitTable[0x74].floatVal = 2.8026e-45;
  featureLimitTable[0x74].format = ~LIMIT_FORMAT_SIGNED_INT;
  featureLimitTable[0x74].type = 0x1e0;
  featureLimitTable[0x75]._0_8_ = anon_var_dwarf_1de8d8;
  featureLimitTable[0x75].name._0_4_ = 0;
  featureLimitTable[0x75].name._4_4_ = 0;
  featureLimitTable[0x75].uintVal = 0;
  featureLimitTable[0x75].intVal = 0;
  featureLimitTable[0x75].deviceSizeVal._0_4_ = 0;
  featureLimitTable[0x75].deviceSizeVal._4_4_ = 3;
  featureLimitTable[0x75].floatVal = 2.8026e-45;
  featureLimitTable[0x75].format = ~LIMIT_FORMAT_SIGNED_INT;
  featureLimitTable[0x75].type = 0x1e8;
  featureLimitTable[0x76]._0_8_ = anon_var_dwarf_1de8e3;
  featureLimitTable[0x76].name._0_4_ = 0;
  featureLimitTable[0x76].name._4_4_ = 0;
  featureLimitTable[0x76].uintVal = 0;
  featureLimitTable[0x76].intVal = 0;
  featureLimitTable[0x76].deviceSizeVal._0_4_ = 0;
  featureLimitTable[0x76].deviceSizeVal._4_4_ = 3;
  featureLimitTable[0x76].floatVal = 2.8026e-45;
  featureLimitTable[0x76].format = ~LIMIT_FORMAT_SIGNED_INT;
  featureLimitTable[0x76].type = 0x1f0;
  featureLimitTable[0x77]._0_8_ = anon_var_dwarf_1de8ee;
  featureLimitTable[0x77].name._0_4_ = 0;
  featureLimitTable[0x77].name._4_4_ = 0;
  featureLimitTable[0x77].uintVal = 1;
  featureLimitTable[0x77].intVal = 0;
  featureLimitTable[0x77].deviceSizeVal._0_4_ = 0;
  featureLimitTable[0x77].deviceSizeVal._4_4_ = 3;
  featureLimitTable[0x77].floatVal = 0.0;
  featureLimitTable[0x77].format = ~LIMIT_FORMAT_SIGNED_INT;
  featureLimitTable[0x77].type = 0x1f0;
  featureLimitTable[0x78]._0_8_ = anon_var_dwarf_1de8ee;
  featureLimitTable[0x78].name._0_4_ = 0;
  featureLimitTable[0x78].name._4_4_ = 0;
  featureLimitTable[0x78].uintVal = 0x100;
  featureLimitTable[0x78].intVal = 0;
  featureLimitTable[0x78].deviceSizeVal._0_4_ = 0;
  featureLimitTable[0x78].deviceSizeVal._4_4_ = 3;
  featureLimitTable[0x78].floatVal = 1.4013e-45;
  featureLimitTable[0x78].format = ~LIMIT_FORMAT_SIGNED_INT;
  memcpy(local_1d48,&DAT_0165dad0,0x660);
  tcu::TestLog::operator<<(&local_1ec8,log,(BeginMessageToken *)&tcu::TestLog::Message);
  pMVar1 = tcu::MessageBuilder::operator<<(&local_1ec8,value);
  tcu::MessageBuilder::operator<<(pMVar1,(EndMessageToken *)&tcu::TestLog::EndMessage);
  tcu::MessageBuilder::~MessageBuilder(&local_1ec8);
  ndx_1 = 0;
  do {
    if (0x78 < ndx_1) {
      for (local_1ee0 = 0; local_1ee0 < 0x79; local_1ee0 = local_1ee0 + 1) {
        switch(*(undefined4 *)((long)&featureLimitTable[local_1ee0].deviceSizeVal + 4)) {
        case 0:
          local_24f4 = *(deUint32 *)((long)&featureLimitTable[local_1ee0].name + 4);
          if ((featureLimitTable[local_1ee0].format != ~LIMIT_FORMAT_SIGNED_INT) &&
             (*(int *)((long)&features->robustBufferAccess +
                      (ulong)*(uint *)&unsupportedFeatureTable
                                       [(int)featureLimitTable[local_1ee0].format].name) == 0)) {
            local_24f4 = unsupportedFeatureTable[(int)featureLimitTable[local_1ee0].format].
                         featureOffset;
          }
          if (featureLimitTable[local_1ee0].floatVal == 0.0) {
            if (*(int *)((long)&value->maxImageDimension1D +
                        (ulong)(uint)unsupportedFeatureTable[(ulong)local_1ee0 + 0x21].floatVal) <
                (int)local_24f4) {
              tcu::TestLog::operator<<(&local_2678,log,(BeginMessageToken *)&tcu::TestLog::Message);
              pMVar1 = tcu::MessageBuilder::operator<<
                                 (&local_2678,(char (*) [26])"limit validation failed, ");
              pMVar1 = tcu::MessageBuilder::operator<<
                                 (pMVar1,(char **)(featureLimitTable + local_1ee0));
              pMVar1 = tcu::MessageBuilder::operator<<
                                 (pMVar1,(char (*) [37])" not valid-limit type MIN actual is ");
              pMVar1 = tcu::MessageBuilder::operator<<
                                 (pMVar1,(int *)((long)&value->maxImageDimension1D +
                                                (ulong)(uint)unsupportedFeatureTable
                                                             [(ulong)local_1ee0 + 0x21].floatVal));
              tcu::MessageBuilder::operator<<(pMVar1,(EndMessageToken *)&tcu::TestLog::EndMessage);
              tcu::MessageBuilder::~MessageBuilder(&local_2678);
              limits._7_1_ = false;
            }
          }
          else if ((featureLimitTable[local_1ee0].floatVal == 1.4013e-45) &&
                  ((int)local_24f4 <
                   *(int *)((long)&value->maxImageDimension1D +
                           (ulong)(uint)unsupportedFeatureTable[(ulong)local_1ee0 + 0x21].floatVal))
                  ) {
            tcu::TestLog::operator<<
                      ((MessageBuilder *)&limitToCheck_3,log,
                       (BeginMessageToken *)&tcu::TestLog::Message);
            pMVar1 = tcu::MessageBuilder::operator<<
                               ((MessageBuilder *)&limitToCheck_3,
                                (char (*) [26])"limit validation failed, ");
            pMVar1 = tcu::MessageBuilder::operator<<
                               (pMVar1,(char **)(featureLimitTable + local_1ee0));
            pMVar1 = tcu::MessageBuilder::operator<<
                               (pMVar1,(char (*) [37])" not valid-limit type MAX actual is ");
            pMVar1 = tcu::MessageBuilder::operator<<
                               (pMVar1,(int *)((long)&value->maxImageDimension1D +
                                              (ulong)(uint)unsupportedFeatureTable
                                                           [(ulong)local_1ee0 + 0x21].floatVal));
            tcu::MessageBuilder::operator<<(pMVar1,(EndMessageToken *)&tcu::TestLog::EndMessage);
            tcu::MessageBuilder::~MessageBuilder((MessageBuilder *)&limitToCheck_3);
            limits._7_1_ = false;
          }
          break;
        case 1:
          local_1ee4 = *(uint *)&featureLimitTable[local_1ee0].name;
          if ((featureLimitTable[local_1ee0].format != ~LIMIT_FORMAT_SIGNED_INT) &&
             (*(int *)((long)&features->robustBufferAccess +
                      (ulong)*(uint *)&unsupportedFeatureTable
                                       [(int)featureLimitTable[local_1ee0].format].name) == 0)) {
            local_1ee4 = *(uint *)((long)&unsupportedFeatureTable
                                          [(int)featureLimitTable[local_1ee0].format].name + 4);
          }
          if (featureLimitTable[local_1ee0].floatVal == 0.0) {
            if (*(uint *)((long)&value->maxImageDimension1D +
                         (ulong)(uint)unsupportedFeatureTable[(ulong)local_1ee0 + 0x21].floatVal) <
                local_1ee4) {
              tcu::TestLog::operator<<(&local_2068,log,(BeginMessageToken *)&tcu::TestLog::Message);
              pMVar1 = tcu::MessageBuilder::operator<<
                                 (&local_2068,(char (*) [25])"limit Validation failed ");
              pMVar1 = tcu::MessageBuilder::operator<<
                                 (pMVar1,(char **)(featureLimitTable + local_1ee0));
              pMVar1 = tcu::MessageBuilder::operator<<
                                 (pMVar1,(char (*) [39])" not valid-limit type MIN - actual is ");
              pMVar1 = tcu::MessageBuilder::operator<<
                                 (pMVar1,(uint *)((long)&value->maxImageDimension1D +
                                                 (ulong)(uint)unsupportedFeatureTable
                                                              [(ulong)local_1ee0 + 0x21].floatVal));
              tcu::MessageBuilder::operator<<(pMVar1,(EndMessageToken *)&tcu::TestLog::EndMessage);
              tcu::MessageBuilder::~MessageBuilder(&local_2068);
              limits._7_1_ = false;
            }
          }
          else if ((featureLimitTable[local_1ee0].floatVal == 1.4013e-45) &&
                  (local_1ee4 <
                   *(uint *)((long)&value->maxImageDimension1D +
                            (ulong)(uint)unsupportedFeatureTable[(ulong)local_1ee0 + 0x21].floatVal)
                  )) {
            tcu::TestLog::operator<<
                      ((MessageBuilder *)local_21e8,log,(BeginMessageToken *)&tcu::TestLog::Message)
            ;
            pMVar1 = tcu::MessageBuilder::operator<<
                               ((MessageBuilder *)local_21e8,
                                (char (*) [27])"limit validation failed,  ");
            pMVar1 = tcu::MessageBuilder::operator<<
                               (pMVar1,(char **)(featureLimitTable + local_1ee0));
            pMVar1 = tcu::MessageBuilder::operator<<
                               (pMVar1,(char (*) [39])" not valid-limit type MAX - actual is ");
            pMVar1 = tcu::MessageBuilder::operator<<
                               (pMVar1,(uint *)((long)&value->maxImageDimension1D +
                                               (ulong)(uint)unsupportedFeatureTable
                                                            [(ulong)local_1ee0 + 0x21].floatVal));
            tcu::MessageBuilder::operator<<(pMVar1,(EndMessageToken *)&tcu::TestLog::EndMessage);
            tcu::MessageBuilder::~MessageBuilder((MessageBuilder *)local_21e8);
            limits._7_1_ = false;
          }
          break;
        case 2:
          local_21ec = *(float *)&featureLimitTable[local_1ee0].deviceSizeVal;
          if ((featureLimitTable[local_1ee0].format != ~LIMIT_FORMAT_SIGNED_INT) &&
             (*(int *)((long)&features->robustBufferAccess +
                      (ulong)*(uint *)&unsupportedFeatureTable
                                       [(int)featureLimitTable[local_1ee0].format].name) == 0)) {
            local_21ec = *(float *)&unsupportedFeatureTable
                                    [(int)featureLimitTable[local_1ee0].format].deviceSizeVal;
          }
          if (featureLimitTable[local_1ee0].floatVal == 0.0) {
            if (*(float *)((long)&value->maxImageDimension1D +
                          (ulong)(uint)unsupportedFeatureTable[(ulong)local_1ee0 + 0x21].floatVal) <
                local_21ec) {
              tcu::TestLog::operator<<(&local_2370,log,(BeginMessageToken *)&tcu::TestLog::Message);
              pMVar1 = tcu::MessageBuilder::operator<<
                                 (&local_2370,(char (*) [26])"limit validation failed, ");
              pMVar1 = tcu::MessageBuilder::operator<<
                                 (pMVar1,(char **)(featureLimitTable + local_1ee0));
              pMVar1 = tcu::MessageBuilder::operator<<
                                 (pMVar1,(char (*) [39])" not valid-limit type MIN - actual is ");
              pMVar1 = tcu::MessageBuilder::operator<<
                                 (pMVar1,(float *)((long)&value->maxImageDimension1D +
                                                  (ulong)(uint)unsupportedFeatureTable
                                                               [(ulong)local_1ee0 + 0x21].floatVal))
              ;
              tcu::MessageBuilder::operator<<(pMVar1,(EndMessageToken *)&tcu::TestLog::EndMessage);
              tcu::MessageBuilder::~MessageBuilder(&local_2370);
              limits._7_1_ = false;
            }
          }
          else if ((featureLimitTable[local_1ee0].floatVal == 1.4013e-45) &&
                  (local_21ec <
                   *(float *)((long)&value->maxImageDimension1D +
                             (ulong)(uint)unsupportedFeatureTable[(ulong)local_1ee0 + 0x21].floatVal
                             ))) {
            tcu::TestLog::operator<<
                      ((MessageBuilder *)local_24f0,log,(BeginMessageToken *)&tcu::TestLog::Message)
            ;
            pMVar1 = tcu::MessageBuilder::operator<<
                               ((MessageBuilder *)local_24f0,
                                (char (*) [26])"limit validation failed, ");
            pMVar1 = tcu::MessageBuilder::operator<<
                               (pMVar1,(char **)(featureLimitTable + local_1ee0));
            pMVar1 = tcu::MessageBuilder::operator<<
                               (pMVar1,(char (*) [37])" not valid-limit type MAX actual is ");
            pMVar1 = tcu::MessageBuilder::operator<<
                               (pMVar1,(float *)((long)&value->maxImageDimension1D +
                                                (ulong)(uint)unsupportedFeatureTable
                                                             [(ulong)local_1ee0 + 0x21].floatVal));
            tcu::MessageBuilder::operator<<(pMVar1,(EndMessageToken *)&tcu::TestLog::EndMessage);
            tcu::MessageBuilder::~MessageBuilder((MessageBuilder *)local_24f0);
            limits._7_1_ = false;
          }
          break;
        case 3:
          local_2800._0_4_ = featureLimitTable[local_1ee0].uintVal;
          local_2800._4_4_ = featureLimitTable[local_1ee0].intVal;
          if ((featureLimitTable[local_1ee0].format != ~LIMIT_FORMAT_SIGNED_INT) &&
             (*(int *)((long)&features->robustBufferAccess +
                      (ulong)*(uint *)&unsupportedFeatureTable
                                       [(int)featureLimitTable[local_1ee0].format].name) == 0)) {
            local_2800 = *(ulong *)&unsupportedFeatureTable
                                    [(int)featureLimitTable[local_1ee0].format].intVal;
          }
          if (featureLimitTable[local_1ee0].floatVal == 0.0) {
            if (*(ulong *)((long)&value->maxImageDimension1D +
                          (ulong)(uint)unsupportedFeatureTable[(ulong)local_1ee0 + 0x21].floatVal) <
                local_2800) {
              tcu::TestLog::operator<<(&local_2980,log,(BeginMessageToken *)&tcu::TestLog::Message);
              pMVar1 = tcu::MessageBuilder::operator<<
                                 (&local_2980,(char (*) [26])"limit validation failed, ");
              pMVar1 = tcu::MessageBuilder::operator<<
                                 (pMVar1,(char **)(featureLimitTable + local_1ee0));
              pMVar1 = tcu::MessageBuilder::operator<<
                                 (pMVar1,(char (*) [37])" not valid-limit type MIN actual is ");
              pMVar1 = tcu::MessageBuilder::operator<<
                                 (pMVar1,(unsigned_long *)
                                         ((long)&value->maxImageDimension1D +
                                         (ulong)(uint)unsupportedFeatureTable
                                                      [(ulong)local_1ee0 + 0x21].floatVal));
              tcu::MessageBuilder::operator<<(pMVar1,(EndMessageToken *)&tcu::TestLog::EndMessage);
              tcu::MessageBuilder::~MessageBuilder(&local_2980);
              limits._7_1_ = false;
            }
          }
          else if ((featureLimitTable[local_1ee0].floatVal == 1.4013e-45) &&
                  (local_2800 <
                   *(ulong *)((long)&value->maxImageDimension1D +
                             (ulong)(uint)unsupportedFeatureTable[(ulong)local_1ee0 + 0x21].floatVal
                             ))) {
            tcu::TestLog::operator<<
                      ((MessageBuilder *)local_2b00,log,(BeginMessageToken *)&tcu::TestLog::Message)
            ;
            pMVar1 = tcu::MessageBuilder::operator<<
                               ((MessageBuilder *)local_2b00,
                                (char (*) [26])"limit validation failed, ");
            pMVar1 = tcu::MessageBuilder::operator<<
                               (pMVar1,(char **)(featureLimitTable + local_1ee0));
            pMVar1 = tcu::MessageBuilder::operator<<
                               (pMVar1,(char (*) [37])" not valid-limit type MAX actual is ");
            pMVar1 = tcu::MessageBuilder::operator<<
                               (pMVar1,(unsigned_long *)
                                       ((long)&value->maxImageDimension1D +
                                       (ulong)(uint)unsupportedFeatureTable
                                                    [(ulong)local_1ee0 + 0x21].floatVal));
            tcu::MessageBuilder::operator<<(pMVar1,(EndMessageToken *)&tcu::TestLog::EndMessage);
            tcu::MessageBuilder::~MessageBuilder((MessageBuilder *)local_2b00);
            limits._7_1_ = false;
          }
          break;
        case 4:
          local_2b04 = *(uint *)&featureLimitTable[local_1ee0].name;
          if ((featureLimitTable[local_1ee0].format != ~LIMIT_FORMAT_SIGNED_INT) &&
             (*(int *)((long)&features->robustBufferAccess +
                      (ulong)*(uint *)&unsupportedFeatureTable
                                       [(int)featureLimitTable[local_1ee0].format].name) == 0)) {
            local_2b04 = *(uint *)((long)&unsupportedFeatureTable
                                          [(int)featureLimitTable[local_1ee0].format].name + 4);
          }
          if ((featureLimitTable[local_1ee0].floatVal == 0.0) &&
             ((*(uint *)((long)&value->maxImageDimension1D +
                        (ulong)(uint)unsupportedFeatureTable[(ulong)local_1ee0 + 0x21].floatVal) &
              local_2b04) != local_2b04)) {
            tcu::TestLog::operator<<
                      ((MessageBuilder *)local_2c88,log,(BeginMessageToken *)&tcu::TestLog::Message)
            ;
            pMVar1 = tcu::MessageBuilder::operator<<
                               ((MessageBuilder *)local_2c88,
                                (char (*) [26])"limit validation failed, ");
            pMVar1 = tcu::MessageBuilder::operator<<
                               (pMVar1,(char **)(featureLimitTable + local_1ee0));
            pMVar1 = tcu::MessageBuilder::operator<<
                               (pMVar1,(char (*) [41])" not valid-limit type bitmask actual is ");
            pMVar1 = tcu::MessageBuilder::operator<<
                               (pMVar1,(unsigned_long *)
                                       ((long)&value->maxImageDimension1D +
                                       (ulong)(uint)unsupportedFeatureTable
                                                    [(ulong)local_1ee0 + 0x21].floatVal));
            tcu::MessageBuilder::operator<<(pMVar1,(EndMessageToken *)&tcu::TestLog::EndMessage);
            tcu::MessageBuilder::~MessageBuilder((MessageBuilder *)local_2c88);
            limits._7_1_ = false;
          }
          break;
        default:
          limits._7_1_ = false;
        }
      }
      for (local_2c8c = 0; local_2c8c < 2; local_2c8c = local_2c8c + 1) {
        if ((properties->limits).maxViewportDimensions[local_2c8c] <
            (properties->limits).maxImageDimension2D) {
          tcu::TestLog::operator<<(&local_2e10,log,(BeginMessageToken *)&tcu::TestLog::Message);
          pMVar1 = tcu::MessageBuilder::operator<<
                             (&local_2e10,
                              (char (*) [49])"limit validation failed, maxImageDimension2D of ");
          pMVar1 = tcu::MessageBuilder::operator<<(pMVar1,&(properties->limits).maxImageDimension2D)
          ;
          pMVar1 = tcu::MessageBuilder::operator<<
                             (pMVar1,(char (*) [37])"is larger than maxViewportDimension[");
          pMVar1 = tcu::MessageBuilder::operator<<(pMVar1,&local_2c8c);
          pMVar1 = tcu::MessageBuilder::operator<<(pMVar1,(char (*) [6])0x12c9929);
          pMVar1 = tcu::MessageBuilder::operator<<
                             (pMVar1,(properties->limits).maxViewportDimensions + local_2c8c);
          tcu::MessageBuilder::operator<<(pMVar1,(EndMessageToken *)&tcu::TestLog::EndMessage);
          tcu::MessageBuilder::~MessageBuilder(&local_2e10);
          limits._7_1_ = false;
        }
      }
      if ((float)((properties->limits).maxViewportDimensions[0] * -2) <
          (properties->limits).viewportBoundsRange[0]) {
        tcu::TestLog::operator<<(&local_2f90,log,(BeginMessageToken *)&tcu::TestLog::Message);
        pMVar1 = tcu::MessageBuilder::operator<<
                           (&local_2f90,
                            (char (*) [52])"limit validation failed, viewPortBoundsRange[0] of ");
        pMVar1 = tcu::MessageBuilder::operator<<(pMVar1,(properties->limits).viewportBoundsRange);
        pMVar1 = tcu::MessageBuilder::operator<<
                           (pMVar1,(char (*) [46])"is larger than -2*maxViewportDimension[0] of ");
        local_2f94 = (properties->limits).maxViewportDimensions[0] * -2;
        pMVar1 = tcu::MessageBuilder::operator<<(pMVar1,&local_2f94);
        tcu::MessageBuilder::operator<<(pMVar1,(EndMessageToken *)&tcu::TestLog::EndMessage);
        tcu::MessageBuilder::~MessageBuilder(&local_2f90);
        limits._7_1_ = false;
      }
      if ((properties->limits).viewportBoundsRange[1] <
          (float)((properties->limits).maxViewportDimensions[1] * 2 - 1)) {
        tcu::TestLog::operator<<(&local_3118,log,(BeginMessageToken *)&tcu::TestLog::Message);
        pMVar1 = tcu::MessageBuilder::operator<<
                           (&local_3118,
                            (char (*) [52])"limit validation failed, viewportBoundsRange[1] of ");
        pMVar1 = tcu::MessageBuilder::operator<<
                           (pMVar1,(properties->limits).viewportBoundsRange + 1);
        pMVar1 = tcu::MessageBuilder::operator<<
                           (pMVar1,(char (*) [43])"is less than 2*maxViewportDimension[1] of ");
        local_311c = (properties->limits).maxViewportDimensions[1] * 2;
        pMVar1 = tcu::MessageBuilder::operator<<(pMVar1,&local_311c);
        tcu::MessageBuilder::operator<<(pMVar1,(EndMessageToken *)&tcu::TestLog::EndMessage);
        tcu::MessageBuilder::~MessageBuilder(&local_3118);
        limits._7_1_ = false;
      }
      return limits._7_1_;
    }
    for (limitToCheck = 0; limitToCheck < 0x22; limitToCheck = limitToCheck + 1) {
      if (unsupportedFeatureTable[(ulong)limitToCheck - 1].floatVal ==
          unsupportedFeatureTable[(ulong)ndx_1 + 0x21].floatVal) {
        featureLimitTable[ndx_1].format = limitToCheck;
        break;
      }
    }
    ndx_1 = ndx_1 + 1;
  } while( true );
}

Assistant:

bool validateFeatureLimits(VkPhysicalDeviceProperties* properties, VkPhysicalDeviceFeatures* features, TestLog& log)
{
	bool						limitsOk	= true;
	VkPhysicalDeviceLimits*		limits		= &properties->limits;
	struct FeatureLimitTable
	{
		deUint32		offset;
		const char*		name;
		deUint32		uintVal;			//!< Format is UNSIGNED_INT
		deInt32			intVal;				//!< Format is SIGNED_INT
		deUint64		deviceSizeVal;		//!< Format is DEVICE_SIZE
		float			floatVal;			//!< Format is FLOAT
		LimitFormat		format;
		LimitType		type;
		deInt32			unsuppTableNdx;
	} featureLimitTable[] =   //!< Based on 1.0.28 Vulkan spec
	{
		{ LIMIT(maxImageDimension1D),								4096, 0, 0, 0.0f, LIMIT_FORMAT_UNSIGNED_INT, LIMIT_TYPE_MIN, -1 },
		{ LIMIT(maxImageDimension2D),								4096, 0, 0, 0.0f, LIMIT_FORMAT_UNSIGNED_INT, LIMIT_TYPE_MIN , -1 },
		{ LIMIT(maxImageDimension3D),								256, 0, 0, 0.0f, LIMIT_FORMAT_UNSIGNED_INT, LIMIT_TYPE_MIN  , -1 },
		{ LIMIT(maxImageDimensionCube),								4096, 0, 0, 0.0f, LIMIT_FORMAT_UNSIGNED_INT, LIMIT_TYPE_MIN , -1 },
		{ LIMIT(maxImageArrayLayers),								256, 0, 0, 0.0f, LIMIT_FORMAT_UNSIGNED_INT, LIMIT_TYPE_MIN   , -1 },
		{ LIMIT(maxTexelBufferElements),							65536, 0, 0, 0.0f, LIMIT_FORMAT_UNSIGNED_INT, LIMIT_TYPE_MIN  , -1 },
		{ LIMIT(maxUniformBufferRange),								16384, 0, 0, 0.0f, LIMIT_FORMAT_UNSIGNED_INT, LIMIT_TYPE_MIN  , -1 },
		{ LIMIT(maxStorageBufferRange),								0, 0, 0, 0, LIMIT_FORMAT_UNSIGNED_INT, LIMIT_TYPE_NONE, -1 },
		{ LIMIT(maxPushConstantsSize),								128, 0, 0, 0.0f, LIMIT_FORMAT_UNSIGNED_INT, LIMIT_TYPE_MIN  , -1 },
		{ LIMIT(maxMemoryAllocationCount),							4096, 0, 0, 0.0f, LIMIT_FORMAT_UNSIGNED_INT, LIMIT_TYPE_MIN , -1 },
		{ LIMIT(maxSamplerAllocationCount),							0, 0, 0, 0.0f, LIMIT_FORMAT_UNSIGNED_INT, LIMIT_TYPE_NONE , -1 },
		{ LIMIT(bufferImageGranularity),							0, 0, 1, 0.0f, LIMIT_FORMAT_DEVICE_SIZE, LIMIT_TYPE_MIN, -1 },
		{ LIMIT(bufferImageGranularity),							0, 0, 131072, 0.0f, LIMIT_FORMAT_DEVICE_SIZE, LIMIT_TYPE_MAX, -1 },
		{ LIMIT(sparseAddressSpaceSize),							0, 0, 2UL*1024*1024*1024, 0.0f, LIMIT_FORMAT_DEVICE_SIZE, LIMIT_TYPE_MIN, -1 },
		{ LIMIT(maxBoundDescriptorSets),							4, 0, 0, 0.0f, LIMIT_FORMAT_UNSIGNED_INT, LIMIT_TYPE_MIN, -1 },
		{ LIMIT(maxPerStageDescriptorSamplers),						16, 0, 0, 0.0f, LIMIT_FORMAT_UNSIGNED_INT, LIMIT_TYPE_MIN, -1 },
		{ LIMIT(maxPerStageDescriptorUniformBuffers),				12, 0, 0, 0.0f, LIMIT_FORMAT_UNSIGNED_INT, LIMIT_TYPE_MIN , -1 },
		{ LIMIT(maxPerStageDescriptorStorageBuffers),				4, 0, 0, 0.0f, LIMIT_FORMAT_UNSIGNED_INT, LIMIT_TYPE_MIN , -1 },
		{ LIMIT(maxPerStageDescriptorSampledImages),				16, 0, 0, 0.0f, LIMIT_FORMAT_UNSIGNED_INT, LIMIT_TYPE_MIN , -1 },
		{ LIMIT(maxPerStageDescriptorStorageImages),				4, 0, 0, 0.0f, LIMIT_FORMAT_UNSIGNED_INT, LIMIT_TYPE_MIN , -1 },
		{ LIMIT(maxPerStageDescriptorInputAttachments),				4, 0, 0, 0.0f, LIMIT_FORMAT_UNSIGNED_INT, LIMIT_TYPE_MIN , -1 },
		{ LIMIT(maxPerStageResources),								0, 0, 0, 0.0f, LIMIT_FORMAT_UNSIGNED_INT, LIMIT_TYPE_NONE , -1 },
		{ LIMIT(maxDescriptorSetSamplers),							96, 0, 0, 0.0f, LIMIT_FORMAT_UNSIGNED_INT, LIMIT_TYPE_MIN, -1 },
		{ LIMIT(maxDescriptorSetUniformBuffers),					72, 0, 0, 0.0f, LIMIT_FORMAT_UNSIGNED_INT, LIMIT_TYPE_MIN , -1 },
		{ LIMIT(maxDescriptorSetUniformBuffersDynamic),				8, 0, 0, 0.0f, LIMIT_FORMAT_UNSIGNED_INT, LIMIT_TYPE_MIN, -1 },
		{ LIMIT(maxDescriptorSetStorageBuffers),					24, 0, 0, 0.0f, LIMIT_FORMAT_UNSIGNED_INT, LIMIT_TYPE_MIN , -1 },
		{ LIMIT(maxDescriptorSetStorageBuffersDynamic),				4, 0, 0, 0.0f, LIMIT_FORMAT_UNSIGNED_INT, LIMIT_TYPE_MIN  , -1 },
		{ LIMIT(maxDescriptorSetSampledImages),						96, 0, 0, 0.0f, LIMIT_FORMAT_UNSIGNED_INT, LIMIT_TYPE_MIN  , -1 },
		{ LIMIT(maxDescriptorSetStorageImages),						24, 0, 0, 0.0f, LIMIT_FORMAT_UNSIGNED_INT, LIMIT_TYPE_MIN  , -1 },
		{ LIMIT(maxDescriptorSetInputAttachments),					0, 0, 0, 0.0f, LIMIT_FORMAT_UNSIGNED_INT, LIMIT_TYPE_NONE  , -1 },
		{ LIMIT(maxVertexInputAttributes),							16, 0, 0, 0.0f, LIMIT_FORMAT_UNSIGNED_INT, LIMIT_TYPE_MIN  , -1 },
		{ LIMIT(maxVertexInputBindings),							16, 0, 0, 0.0f, LIMIT_FORMAT_UNSIGNED_INT, LIMIT_TYPE_MIN  , -1 },
		{ LIMIT(maxVertexInputAttributeOffset),						2047, 0, 0, 0.0f, LIMIT_FORMAT_UNSIGNED_INT, LIMIT_TYPE_MIN  , -1 },
		{ LIMIT(maxVertexInputBindingStride),						2048, 0, 0, 0.0f, LIMIT_FORMAT_UNSIGNED_INT, LIMIT_TYPE_MIN  , -1 },
		{ LIMIT(maxVertexOutputComponents),							64, 0, 0, 0.0f, LIMIT_FORMAT_UNSIGNED_INT, LIMIT_TYPE_MIN  , -1 },
		{ LIMIT(maxTessellationGenerationLevel),					64, 0, 0, 0.0f, LIMIT_FORMAT_UNSIGNED_INT, LIMIT_TYPE_MIN  , -1 },
		{ LIMIT(maxTessellationPatchSize),							32, 0, 0, 0.0f, LIMIT_FORMAT_UNSIGNED_INT, LIMIT_TYPE_MIN , -1 },
		{ LIMIT(maxTessellationControlPerVertexInputComponents),	64, 0, 0, 0.0f, LIMIT_FORMAT_UNSIGNED_INT, LIMIT_TYPE_MIN  , -1 },
		{ LIMIT(maxTessellationControlPerVertexOutputComponents),	64, 0, 0, 0.0f, LIMIT_FORMAT_UNSIGNED_INT, LIMIT_TYPE_MIN  , -1 },
		{ LIMIT(maxTessellationControlPerPatchOutputComponents),	120, 0, 0, 0.0f, LIMIT_FORMAT_UNSIGNED_INT, LIMIT_TYPE_MIN  , -1 },
		{ LIMIT(maxTessellationControlTotalOutputComponents),		2048, 0, 0, 0.0f, LIMIT_FORMAT_UNSIGNED_INT, LIMIT_TYPE_MIN  , -1 },
		{ LIMIT(maxTessellationEvaluationInputComponents),			64, 0, 0, 0.0f, LIMIT_FORMAT_UNSIGNED_INT, LIMIT_TYPE_MIN  , -1 },
		{ LIMIT(maxTessellationEvaluationOutputComponents),			64, 0, 0, 0.0f, LIMIT_FORMAT_UNSIGNED_INT, LIMIT_TYPE_MIN  , -1 },
		{ LIMIT(maxGeometryShaderInvocations),						32, 0, 0, 0.0f, LIMIT_FORMAT_UNSIGNED_INT, LIMIT_TYPE_MIN  , -1 },
		{ LIMIT(maxGeometryInputComponents),						64, 0, 0, 0.0f, LIMIT_FORMAT_UNSIGNED_INT, LIMIT_TYPE_MIN  , -1 },
		{ LIMIT(maxGeometryOutputComponents),						64, 0, 0, 0.0f, LIMIT_FORMAT_UNSIGNED_INT, LIMIT_TYPE_MIN  , -1 },
		{ LIMIT(maxGeometryOutputVertices),							256, 0, 0, 0.0f, LIMIT_FORMAT_UNSIGNED_INT, LIMIT_TYPE_MIN  , -1 },
		{ LIMIT(maxGeometryTotalOutputComponents),					1024, 0, 0, 0.0f, LIMIT_FORMAT_UNSIGNED_INT, LIMIT_TYPE_MIN  , -1 },
		{ LIMIT(maxFragmentInputComponents),						64, 0, 0, 0.0f, LIMIT_FORMAT_UNSIGNED_INT, LIMIT_TYPE_MIN  , -1 },
		{ LIMIT(maxFragmentOutputAttachments),						4, 0, 0, 0.0f, LIMIT_FORMAT_UNSIGNED_INT, LIMIT_TYPE_MIN  , -1 },
		{ LIMIT(maxFragmentDualSrcAttachments),						1, 0, 0, 0.0f, LIMIT_FORMAT_UNSIGNED_INT, LIMIT_TYPE_MIN  , -1 },
		{ LIMIT(maxFragmentCombinedOutputResources),				4, 0, 0, 0.0f, LIMIT_FORMAT_UNSIGNED_INT, LIMIT_TYPE_MIN  , -1 },
		{ LIMIT(maxComputeSharedMemorySize),						16384, 0, 0, 0.0f, LIMIT_FORMAT_UNSIGNED_INT, LIMIT_TYPE_MIN   , -1 },
		{ LIMIT(maxComputeWorkGroupCount[0]),						65535, 0, 0, 0.0f, LIMIT_FORMAT_UNSIGNED_INT, LIMIT_TYPE_MIN   , -1 },
		{ LIMIT(maxComputeWorkGroupCount[1]),						65535, 0, 0, 0.0f, LIMIT_FORMAT_UNSIGNED_INT, LIMIT_TYPE_MIN   , -1 },
		{ LIMIT(maxComputeWorkGroupCount[2]),						65535,  0, 0, 0.0f, LIMIT_FORMAT_UNSIGNED_INT, LIMIT_TYPE_MIN   , -1 },
		{ LIMIT(maxComputeWorkGroupInvocations),					128, 0, 0, 0.0f, LIMIT_FORMAT_UNSIGNED_INT, LIMIT_TYPE_MIN    , -1 },
		{ LIMIT(maxComputeWorkGroupSize[0]),						128, 0, 0, 0.0f, LIMIT_FORMAT_UNSIGNED_INT, LIMIT_TYPE_MIN    , -1 },
		{ LIMIT(maxComputeWorkGroupSize[1]),						128, 0, 0, 0.0f, LIMIT_FORMAT_UNSIGNED_INT, LIMIT_TYPE_MIN    , -1 },
		{ LIMIT(maxComputeWorkGroupSize[2]),						64, 0, 0, 0.0f, LIMIT_FORMAT_UNSIGNED_INT, LIMIT_TYPE_MIN    , -1 },
		{ LIMIT(subPixelPrecisionBits),								4, 0, 0, 0.0f, LIMIT_FORMAT_UNSIGNED_INT, LIMIT_TYPE_MIN    , -1 },
		{ LIMIT(subTexelPrecisionBits),								4, 0, 0, 0.0f, LIMIT_FORMAT_UNSIGNED_INT, LIMIT_TYPE_MIN    , -1 },
		{ LIMIT(mipmapPrecisionBits),								4, 0, 0, 0.0f, LIMIT_FORMAT_UNSIGNED_INT, LIMIT_TYPE_MIN    , -1 },
		{ LIMIT(maxDrawIndexedIndexValue),							(deUint32)~0, 0, 0, 0.0f, LIMIT_FORMAT_UNSIGNED_INT, LIMIT_TYPE_MIN, -1 },
		{ LIMIT(maxDrawIndirectCount),								65535, 0, 0, 0.0f, LIMIT_FORMAT_UNSIGNED_INT, LIMIT_TYPE_MIN    , -1 },
		{ LIMIT(maxSamplerLodBias),									0, 0, 0, 2.0f, LIMIT_FORMAT_FLOAT, LIMIT_TYPE_MIN, -1 },
		{ LIMIT(maxSamplerAnisotropy),								0, 0, 0, 16.0f, LIMIT_FORMAT_FLOAT, LIMIT_TYPE_MIN, -1 },
		{ LIMIT(maxViewports),										16, 0, 0, 0.0f, LIMIT_FORMAT_UNSIGNED_INT, LIMIT_TYPE_MIN, -1 },
		{ LIMIT(maxViewportDimensions[0]),							4096, 0, 0, 0.0f, LIMIT_FORMAT_UNSIGNED_INT, LIMIT_TYPE_MIN , -1 },
		{ LIMIT(maxViewportDimensions[1]),							4096, 0, 0, 0.0f, LIMIT_FORMAT_UNSIGNED_INT, LIMIT_TYPE_MIN , -1 },
		{ LIMIT(viewportBoundsRange[0]),							0, 0, 0, -8192.0f, LIMIT_FORMAT_FLOAT, LIMIT_TYPE_MAX, -1 },
		{ LIMIT(viewportBoundsRange[1]),							0, 0, 0, 8191.0f, LIMIT_FORMAT_FLOAT, LIMIT_TYPE_MIN, -1 },
		{ LIMIT(viewportSubPixelBits),								0, 0, 0, 0.0f, LIMIT_FORMAT_UNSIGNED_INT, LIMIT_TYPE_MIN, -1 },
		{ LIMIT(minMemoryMapAlignment),								64, 0, 0, 0.0f, LIMIT_FORMAT_UNSIGNED_INT, LIMIT_TYPE_MIN, -1 },
		{ LIMIT(minTexelBufferOffsetAlignment),						0, 0, 1, 0.0f, LIMIT_FORMAT_DEVICE_SIZE, LIMIT_TYPE_MIN, -1 },
		{ LIMIT(minTexelBufferOffsetAlignment),						0, 0, 256, 0.0f, LIMIT_FORMAT_DEVICE_SIZE, LIMIT_TYPE_MAX, -1 },
		{ LIMIT(minUniformBufferOffsetAlignment),					0, 0, 1, 0.0f, LIMIT_FORMAT_DEVICE_SIZE, LIMIT_TYPE_MIN, -1 },
		{ LIMIT(minUniformBufferOffsetAlignment),					0, 0, 256, 0.0f, LIMIT_FORMAT_DEVICE_SIZE, LIMIT_TYPE_MAX, -1 },
		{ LIMIT(minStorageBufferOffsetAlignment),					0, 0, 1, 0.0f, LIMIT_FORMAT_DEVICE_SIZE, LIMIT_TYPE_MIN, -1 },
		{ LIMIT(minStorageBufferOffsetAlignment),					0, 0, 256, 0.0f, LIMIT_FORMAT_DEVICE_SIZE, LIMIT_TYPE_MAX, -1 },
		{ LIMIT(minTexelOffset),									0, -8, 0, 0.0f, LIMIT_FORMAT_SIGNED_INT, LIMIT_TYPE_MAX, -1 },
		{ LIMIT(maxTexelOffset),									7, 0, 0, 0.0f, LIMIT_FORMAT_UNSIGNED_INT, LIMIT_TYPE_MIN, -1 },
		{ LIMIT(minTexelGatherOffset),								0, -8, 0, 0.0f, LIMIT_FORMAT_SIGNED_INT, LIMIT_TYPE_MAX, -1 },
		{ LIMIT(maxTexelGatherOffset),								7, 0, 0, 0.0f, LIMIT_FORMAT_UNSIGNED_INT, LIMIT_TYPE_MIN, -1 },
		{ LIMIT(minInterpolationOffset),							0, 0, 0, -0.5f, LIMIT_FORMAT_FLOAT, LIMIT_TYPE_MAX, -1 },
		{ LIMIT(maxInterpolationOffset),							0, 0, 0, 0.5f - (1.0f/deFloatPow(2.0f, (float)limits->subPixelInterpolationOffsetBits)), LIMIT_FORMAT_FLOAT, LIMIT_TYPE_MIN, -1 },
		{ LIMIT(subPixelInterpolationOffsetBits),					4, 0, 0, 0.0f, LIMIT_FORMAT_UNSIGNED_INT, LIMIT_TYPE_MIN, -1 },
		{ LIMIT(maxFramebufferWidth),								4096, 0, 0, 0.0f, LIMIT_FORMAT_UNSIGNED_INT, LIMIT_TYPE_MIN, -1 },
		{ LIMIT(maxFramebufferHeight),								4096, 0, 0, 0.0f, LIMIT_FORMAT_UNSIGNED_INT, LIMIT_TYPE_MIN, -1 },
		{ LIMIT(maxFramebufferLayers),								0, 0, 0, 0.0f, LIMIT_FORMAT_UNSIGNED_INT, LIMIT_TYPE_MIN, -1 },
		{ LIMIT(framebufferColorSampleCounts),						VK_SAMPLE_COUNT_1_BIT|VK_SAMPLE_COUNT_4_BIT, 0, 0, 0.0f, LIMIT_FORMAT_BITMASK, LIMIT_TYPE_MIN, -1 },
		{ LIMIT(framebufferDepthSampleCounts),						VK_SAMPLE_COUNT_1_BIT|VK_SAMPLE_COUNT_4_BIT, 0, 0, 0.0f, LIMIT_FORMAT_BITMASK, LIMIT_TYPE_MIN, -1 },
		{ LIMIT(framebufferStencilSampleCounts),					VK_SAMPLE_COUNT_1_BIT|VK_SAMPLE_COUNT_4_BIT, 0, 0, 0.0f, LIMIT_FORMAT_BITMASK, LIMIT_TYPE_MIN, -1 },
		{ LIMIT(framebufferNoAttachmentsSampleCounts),				VK_SAMPLE_COUNT_1_BIT|VK_SAMPLE_COUNT_4_BIT, 0, 0, 0.0f, LIMIT_FORMAT_BITMASK, LIMIT_TYPE_MIN, -1 },
		{ LIMIT(maxColorAttachments),								4, 0, 0, 0.0f, LIMIT_FORMAT_UNSIGNED_INT, LIMIT_TYPE_MIN, -1 },
		{ LIMIT(sampledImageColorSampleCounts),						VK_SAMPLE_COUNT_1_BIT|VK_SAMPLE_COUNT_4_BIT, 0, 0, 0.0f, LIMIT_FORMAT_BITMASK, LIMIT_TYPE_MIN, -1 },
		{ LIMIT(sampledImageIntegerSampleCounts),					VK_SAMPLE_COUNT_1_BIT, 0, 0, 0.0f, LIMIT_FORMAT_BITMASK, LIMIT_TYPE_MIN, -1 },
		{ LIMIT(sampledImageDepthSampleCounts),						VK_SAMPLE_COUNT_1_BIT|VK_SAMPLE_COUNT_4_BIT, 0, 0, 0.0f, LIMIT_FORMAT_BITMASK, LIMIT_TYPE_MIN, -1 },
		{ LIMIT(sampledImageStencilSampleCounts),					VK_SAMPLE_COUNT_1_BIT|VK_SAMPLE_COUNT_4_BIT, 0, 0, 0.0f, LIMIT_FORMAT_BITMASK, LIMIT_TYPE_MIN, -1 },
		{ LIMIT(storageImageSampleCounts),							VK_SAMPLE_COUNT_1_BIT|VK_SAMPLE_COUNT_4_BIT, 0, 0, 0.0f, LIMIT_FORMAT_BITMASK, LIMIT_TYPE_MIN, -1 },
		{ LIMIT(maxSampleMaskWords),								1, 0, 0, 0.0f, LIMIT_FORMAT_UNSIGNED_INT, LIMIT_TYPE_MIN, -1 },
		{ LIMIT(timestampComputeAndGraphics),						0, 0, 0, 0.0f, LIMIT_FORMAT_UNSIGNED_INT, LIMIT_TYPE_NONE, -1 },
		{ LIMIT(timestampPeriod),									0, 0, 0, 0.0f, LIMIT_FORMAT_UNSIGNED_INT, LIMIT_TYPE_NONE, -1 },
		{ LIMIT(maxClipDistances),									8, 0, 0, 0.0f, LIMIT_FORMAT_UNSIGNED_INT, LIMIT_TYPE_MIN, -1 },
		{ LIMIT(maxCullDistances),									8, 0, 0, 0.0f, LIMIT_FORMAT_UNSIGNED_INT, LIMIT_TYPE_MIN, -1 },
		{ LIMIT(maxCombinedClipAndCullDistances),					8, 0, 0, 0.0f, LIMIT_FORMAT_UNSIGNED_INT, LIMIT_TYPE_MIN, -1 },
		{ LIMIT(discreteQueuePriorities),							8, 0, 0, 0.0f, LIMIT_FORMAT_UNSIGNED_INT, LIMIT_TYPE_NONE, -1 },
		{ LIMIT(pointSizeRange[0]),									0, 0, 0, 0.0f, LIMIT_FORMAT_FLOAT, LIMIT_TYPE_MIN, -1 },
		{ LIMIT(pointSizeRange[0]),									0, 0, 0, 1.0f, LIMIT_FORMAT_FLOAT, LIMIT_TYPE_MAX, -1 },
		{ LIMIT(pointSizeRange[1]),									0, 0, 0, 64.0f - limits->pointSizeGranularity , LIMIT_FORMAT_FLOAT, LIMIT_TYPE_MIN, -1 },
		{ LIMIT(lineWidthRange[0]),									0, 0, 0, 0.0f, LIMIT_FORMAT_FLOAT, LIMIT_TYPE_MIN, -1 },
		{ LIMIT(lineWidthRange[0]),									0, 0, 0, 1.0f, LIMIT_FORMAT_FLOAT, LIMIT_TYPE_MAX, -1 },
		{ LIMIT(lineWidthRange[1]),									0, 0, 0, 8.0f - limits->lineWidthGranularity, LIMIT_FORMAT_FLOAT, LIMIT_TYPE_MIN, -1 },
		{ LIMIT(pointSizeGranularity),								0, 0, 0, 1.0f, LIMIT_FORMAT_FLOAT, LIMIT_TYPE_MAX, -1 },
		{ LIMIT(lineWidthGranularity),								0, 0, 0, 1.0f, LIMIT_FORMAT_FLOAT, LIMIT_TYPE_MAX, -1 },
		{ LIMIT(strictLines),										0, 0, 0, 0.0f, LIMIT_FORMAT_UNSIGNED_INT, LIMIT_TYPE_NONE, -1 },
		{ LIMIT(standardSampleLocations),							0, 0, 0, 0.0f, LIMIT_FORMAT_UNSIGNED_INT, LIMIT_TYPE_NONE, -1 },
		{ LIMIT(optimalBufferCopyOffsetAlignment),					0, 0, 0, 0.0f, LIMIT_FORMAT_DEVICE_SIZE, LIMIT_TYPE_NONE, -1 },
		{ LIMIT(optimalBufferCopyRowPitchAlignment),				0, 0, 0, 0.0f, LIMIT_FORMAT_DEVICE_SIZE, LIMIT_TYPE_NONE, -1 },
		{ LIMIT(nonCoherentAtomSize),								0, 0, 1, 0.0f, LIMIT_FORMAT_DEVICE_SIZE, LIMIT_TYPE_MIN, -1 },
		{ LIMIT(nonCoherentAtomSize),								0, 0, 256, 0.0f, LIMIT_FORMAT_DEVICE_SIZE, LIMIT_TYPE_MAX, -1 },
	};

	const struct UnsupportedFeatureLimitTable
	{
		deUint32		limitOffset;
		const char*		name;
		deUint32		featureOffset;
		deUint32		uintVal;			//!< Format is UNSIGNED_INT
		deInt32			intVal;				//!< Format is SIGNED_INT
		deUint64		deviceSizeVal;		//!< Format is DEVICE_SIZE
		float			floatVal;			//!< Format is FLOAT
	} unsupportedFeatureTable[] =
	{
		{ LIMIT(sparseAddressSpaceSize),							FEATURE(sparseBinding),					0, 0, 0, 0.0f },
		{ LIMIT(maxTessellationGenerationLevel),					FEATURE(tessellationShader),			0, 0, 0, 0.0f },
		{ LIMIT(maxTessellationPatchSize),							FEATURE(tessellationShader),			0, 0, 0, 0.0f },
		{ LIMIT(maxTessellationControlPerVertexInputComponents),	FEATURE(tessellationShader),			0, 0, 0, 0.0f },
		{ LIMIT(maxTessellationControlPerVertexOutputComponents),	FEATURE(tessellationShader),			0, 0, 0, 0.0f },
		{ LIMIT(maxTessellationControlPerPatchOutputComponents),	FEATURE(tessellationShader),			0, 0, 0, 0.0f },
		{ LIMIT(maxTessellationControlTotalOutputComponents),		FEATURE(tessellationShader),			0, 0, 0, 0.0f },
		{ LIMIT(maxTessellationEvaluationInputComponents),			FEATURE(tessellationShader),			0, 0, 0, 0.0f },
		{ LIMIT(maxTessellationEvaluationOutputComponents),			FEATURE(tessellationShader),			0, 0, 0, 0.0f },
		{ LIMIT(maxGeometryShaderInvocations),						FEATURE(geometryShader),				0, 0, 0, 0.0f },
		{ LIMIT(maxGeometryInputComponents),						FEATURE(geometryShader),				0, 0, 0, 0.0f },
		{ LIMIT(maxGeometryOutputComponents),						FEATURE(geometryShader),				0, 0, 0, 0.0f },
		{ LIMIT(maxGeometryOutputVertices),							FEATURE(geometryShader),				0, 0, 0, 0.0f },
		{ LIMIT(maxGeometryTotalOutputComponents),					FEATURE(geometryShader),				0, 0, 0, 0.0f },
		{ LIMIT(maxFragmentDualSrcAttachments),						FEATURE(dualSrcBlend),					0, 0, 0, 0.0f },
		{ LIMIT(maxDrawIndexedIndexValue),							FEATURE(fullDrawIndexUint32),			(1<<24)-1, 0, 0, 0.0f },
		{ LIMIT(maxDrawIndirectCount),								FEATURE(multiDrawIndirect),				1, 0, 0, 0.0f },
		{ LIMIT(maxSamplerAnisotropy),								FEATURE(samplerAnisotropy),				1, 0, 0, 0.0f },
		{ LIMIT(maxViewports),										FEATURE(multiViewport),					1, 0, 0, 0.0f },
		{ LIMIT(minTexelGatherOffset),								FEATURE(shaderImageGatherExtended),		0, 0, 0, 0.0f },
		{ LIMIT(maxTexelGatherOffset),								FEATURE(shaderImageGatherExtended),		0, 0, 0, 0.0f },
		{ LIMIT(minInterpolationOffset),							FEATURE(sampleRateShading),				0, 0, 0, 0.0f },
		{ LIMIT(maxInterpolationOffset),							FEATURE(sampleRateShading),				0, 0, 0, 0.0f },
		{ LIMIT(subPixelInterpolationOffsetBits),					FEATURE(sampleRateShading),				0, 0, 0, 0.0f },
		{ LIMIT(storageImageSampleCounts),							FEATURE(shaderStorageImageMultisample),	VK_SAMPLE_COUNT_1_BIT, 0, 0, 0.0f },
		{ LIMIT(maxClipDistances),									FEATURE(shaderClipDistance),			0, 0, 0, 0.0f },
		{ LIMIT(maxCullDistances),									FEATURE(shaderClipDistance),			0, 0, 0, 0.0f },
		{ LIMIT(maxCombinedClipAndCullDistances),					FEATURE(shaderClipDistance),			0, 0, 0, 0.0f },
		{ LIMIT(pointSizeRange[0]),									FEATURE(largePoints),					0, 0, 0, 1.0f },
		{ LIMIT(pointSizeRange[1]),									FEATURE(largePoints),					0, 0, 0, 1.0f },
		{ LIMIT(lineWidthRange[0]),									FEATURE(wideLines),						0, 0, 0, 1.0f },
		{ LIMIT(lineWidthRange[1]),									FEATURE(wideLines),						0, 0, 0, 1.0f },
		{ LIMIT(pointSizeGranularity),								FEATURE(largePoints),					0, 0, 0, 0.0f },
		{ LIMIT(lineWidthGranularity),								FEATURE(wideLines),						0, 0, 0, 0.0f }
	};

	log << TestLog::Message << *limits << TestLog::EndMessage;

	//!< First build a map from limit to unsupported table index
	for (deUint32 ndx = 0; ndx < DE_LENGTH_OF_ARRAY(featureLimitTable); ndx++)
	{
		for (deUint32 unsuppNdx = 0; unsuppNdx < DE_LENGTH_OF_ARRAY(unsupportedFeatureTable); unsuppNdx++)
		{
			if (unsupportedFeatureTable[unsuppNdx].limitOffset == featureLimitTable[ndx].offset)
			{
				featureLimitTable[ndx].unsuppTableNdx = unsuppNdx;
				break;
			}
		}
	}

	for (deUint32 ndx = 0; ndx < DE_LENGTH_OF_ARRAY(featureLimitTable); ndx++)
	{
		switch (featureLimitTable[ndx].format)
		{
			case LIMIT_FORMAT_UNSIGNED_INT:
			{
				deUint32 limitToCheck = featureLimitTable[ndx].uintVal;
				if (featureLimitTable[ndx].unsuppTableNdx != -1)
				{
					if (*((VkBool32*)((deUint8*)features+unsupportedFeatureTable[featureLimitTable[ndx].unsuppTableNdx].featureOffset)) == VK_FALSE)
						limitToCheck = unsupportedFeatureTable[featureLimitTable[ndx].unsuppTableNdx].uintVal;
				}

				if (featureLimitTable[ndx].type == LIMIT_TYPE_MIN)
				{

					if (*((deUint32*)((deUint8*)limits+featureLimitTable[ndx].offset)) < limitToCheck)
					{
						log << TestLog::Message << "limit Validation failed " << featureLimitTable[ndx].name
							<< " not valid-limit type MIN - actual is "
							<< *((deUint32*)((deUint8*)limits + featureLimitTable[ndx].offset)) << TestLog::EndMessage;
						limitsOk = false;
					}
				}
				else if (featureLimitTable[ndx].type == LIMIT_TYPE_MAX)
				{
					if (*((deUint32*)((deUint8*)limits+featureLimitTable[ndx].offset)) > limitToCheck)
					{
						log << TestLog::Message << "limit validation failed,  " << featureLimitTable[ndx].name
							<< " not valid-limit type MAX - actual is "
							<< *((deUint32*)((deUint8*)limits + featureLimitTable[ndx].offset)) << TestLog::EndMessage;
						limitsOk = false;
					}
				}
				break;
			}

			case LIMIT_FORMAT_FLOAT:
			{
				float limitToCheck = featureLimitTable[ndx].floatVal;
				if (featureLimitTable[ndx].unsuppTableNdx != -1)
				{
					if (*((VkBool32*)((deUint8*)features+unsupportedFeatureTable[featureLimitTable[ndx].unsuppTableNdx].featureOffset)) == VK_FALSE)
						limitToCheck = unsupportedFeatureTable[featureLimitTable[ndx].unsuppTableNdx].floatVal;
				}

				if (featureLimitTable[ndx].type == LIMIT_TYPE_MIN)
				{
					if (*((float*)((deUint8*)limits+featureLimitTable[ndx].offset)) < limitToCheck)
					{
						log << TestLog::Message << "limit validation failed, " << featureLimitTable[ndx].name
							<< " not valid-limit type MIN - actual is "
							<< *((float*)((deUint8*)limits + featureLimitTable[ndx].offset)) << TestLog::EndMessage;
						limitsOk = false;
					}
				}
				else if (featureLimitTable[ndx].type == LIMIT_TYPE_MAX)
				{
					if (*((float*)((deUint8*)limits+featureLimitTable[ndx].offset)) > limitToCheck)
					{
						log << TestLog::Message << "limit validation failed, " << featureLimitTable[ndx].name
							<< " not valid-limit type MAX actual is "
							<< *((float*)((deUint8*)limits + featureLimitTable[ndx].offset)) << TestLog::EndMessage;
						limitsOk = false;
					}
				}
				break;
			}

			case LIMIT_FORMAT_SIGNED_INT:
			{
				deInt32 limitToCheck = featureLimitTable[ndx].intVal;
				if (featureLimitTable[ndx].unsuppTableNdx != -1)
				{
					if (*((VkBool32*)((deUint8*)features+unsupportedFeatureTable[featureLimitTable[ndx].unsuppTableNdx].featureOffset)) == VK_FALSE)
						limitToCheck = unsupportedFeatureTable[featureLimitTable[ndx].unsuppTableNdx].intVal;
				}
				if (featureLimitTable[ndx].type == LIMIT_TYPE_MIN)
				{
					if (*((deInt32*)((deUint8*)limits+featureLimitTable[ndx].offset)) < limitToCheck)
					{
						log << TestLog::Message <<  "limit validation failed, " << featureLimitTable[ndx].name
							<< " not valid-limit type MIN actual is "
							<< *((deInt32*)((deUint8*)limits + featureLimitTable[ndx].offset)) << TestLog::EndMessage;
						limitsOk = false;
					}
				}
				else if (featureLimitTable[ndx].type == LIMIT_TYPE_MAX)
				{
					if (*((deInt32*)((deUint8*)limits+featureLimitTable[ndx].offset)) > limitToCheck)
					{
						log << TestLog::Message << "limit validation failed, " << featureLimitTable[ndx].name
							<< " not valid-limit type MAX actual is "
							<< *((deInt32*)((deUint8*)limits + featureLimitTable[ndx].offset)) << TestLog::EndMessage;
						limitsOk = false;
					}
				}
				break;
			}

			case LIMIT_FORMAT_DEVICE_SIZE:
			{
				deUint64 limitToCheck = featureLimitTable[ndx].deviceSizeVal;
				if (featureLimitTable[ndx].unsuppTableNdx != -1)
				{
					if (*((VkBool32*)((deUint8*)features+unsupportedFeatureTable[featureLimitTable[ndx].unsuppTableNdx].featureOffset)) == VK_FALSE)
						limitToCheck = unsupportedFeatureTable[featureLimitTable[ndx].unsuppTableNdx].deviceSizeVal;
				}

				if (featureLimitTable[ndx].type == LIMIT_TYPE_MIN)
				{
					if (*((deUint64*)((deUint8*)limits+featureLimitTable[ndx].offset)) < limitToCheck)
					{
						log << TestLog::Message << "limit validation failed, " << featureLimitTable[ndx].name
							<< " not valid-limit type MIN actual is "
							<< *((deUint64*)((deUint8*)limits + featureLimitTable[ndx].offset)) << TestLog::EndMessage;
						limitsOk = false;
					}
				}
				else if (featureLimitTable[ndx].type == LIMIT_TYPE_MAX)
				{
					if (*((deUint64*)((deUint8*)limits+featureLimitTable[ndx].offset)) > limitToCheck)
					{
						log << TestLog::Message << "limit validation failed, " << featureLimitTable[ndx].name
							<< " not valid-limit type MAX actual is "
							<< *((deUint64*)((deUint8*)limits + featureLimitTable[ndx].offset)) << TestLog::EndMessage;
						limitsOk = false;
					}
				}
				break;
			}

			case LIMIT_FORMAT_BITMASK:
			{
				deUint32 limitToCheck = featureLimitTable[ndx].uintVal;
				if (featureLimitTable[ndx].unsuppTableNdx != -1)
				{
					if (*((VkBool32*)((deUint8*)features+unsupportedFeatureTable[featureLimitTable[ndx].unsuppTableNdx].featureOffset)) == VK_FALSE)
						limitToCheck = unsupportedFeatureTable[featureLimitTable[ndx].unsuppTableNdx].uintVal;
				}

				if (featureLimitTable[ndx].type == LIMIT_TYPE_MIN)
				{
					if ((*((deUint32*)((deUint8*)limits+featureLimitTable[ndx].offset)) & limitToCheck) != limitToCheck)
					{
						log << TestLog::Message << "limit validation failed, " << featureLimitTable[ndx].name
							<< " not valid-limit type bitmask actual is "
							<< *((deUint64*)((deUint8*)limits + featureLimitTable[ndx].offset)) << TestLog::EndMessage;
						limitsOk = false;
					}
				}
				break;
			}

			default:
				DE_ASSERT(0);
				limitsOk = false;
		}
	}

	for (deUint32 ndx = 0; ndx < DE_LENGTH_OF_ARRAY(limits->maxViewportDimensions); ndx++)
	{
		if (limits->maxImageDimension2D > limits->maxViewportDimensions[ndx])
		{
			log << TestLog::Message << "limit validation failed, maxImageDimension2D of " << limits->maxImageDimension2D
				<< "is larger than maxViewportDimension[" << ndx << "] of " << limits->maxViewportDimensions[ndx] << TestLog::EndMessage;
			limitsOk = false;
		}
	}

	if (limits->viewportBoundsRange[0] > -2 * limits->maxViewportDimensions[0])
	{
		log << TestLog::Message << "limit validation failed, viewPortBoundsRange[0] of " << limits->viewportBoundsRange[0]
			<< "is larger than -2*maxViewportDimension[0] of " << -2*limits->maxViewportDimensions[0] << TestLog::EndMessage;
		limitsOk = false;
	}

	if (limits->viewportBoundsRange[1] < 2 * limits->maxViewportDimensions[1] - 1)
	{
		log << TestLog::Message << "limit validation failed, viewportBoundsRange[1] of " << limits->viewportBoundsRange[1]
			<< "is less than 2*maxViewportDimension[1] of " << 2*limits->maxViewportDimensions[1] << TestLog::EndMessage;
		limitsOk = false;
	}

	return limitsOk;
}